

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O1

void reuse_with_snapshot_test(void)

{
  undefined1 auVar1 [16];
  fdb_status s;
  fdb_status fVar2;
  sb_decision_t sVar3;
  int iVar4;
  fdb_status extraout_EAX;
  fdb_status fVar5;
  size_t keylen;
  size_t sVar6;
  fdb_kvs_handle *pfVar7;
  size_t sVar8;
  size_t sVar9;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *pfVar12;
  char cVar13;
  char *pcVar14;
  fdb_config *pfVar15;
  fdb_config *pfVar16;
  char *pcVar17;
  fdb_doc **doc;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  size_t sVar21;
  char *pcVar22;
  fdb_kvs_handle **ptr_handle;
  __atomic_base<unsigned_long> handle;
  uint uVar23;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar25;
  char *pcVar26;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  size_t rvalue_len;
  void *rvalue;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [512];
  char bodybuf [512];
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_30f0;
  fdb_file_handle *pfStackY_30e8;
  fdb_kvs_config fStackY_30e0;
  char acStackY_30c8 [264];
  fdb_config fStackY_2fc0;
  char acStackY_2ec8 [520];
  fdb_doc **ppfStackY_2cc0;
  size_t sStackY_2cb0;
  char *pcStackY_2ca8;
  char *pcStackY_2ca0;
  code *pcStackY_2c98;
  fdb_kvs_handle *pfStack_2c88;
  fdb_file_handle *pfStack_2c80;
  fdb_iterator *pfStack_2c78;
  fdb_doc *pfStack_2c70;
  fdb_kvs_handle *pfStack_2c68;
  timeval tStack_2c60;
  char acStack_2c50 [512];
  fdb_kvs_config fStack_2a50;
  fdb_file_info fStack_2a38;
  char acStack_29f0 [256];
  fdb_config fStack_28f0;
  char *pcStack_27f8;
  fdb_kvs_handle *pfStack_27f0;
  fdb_kvs_handle *pfStack_27e8;
  fdb_kvs_handle *pfStack_27e0;
  fdb_kvs_handle *pfStack_27d8;
  fdb_kvs_handle *pfStack_27d0;
  fdb_kvs_handle *pfStack_27c0;
  fdb_file_handle *pfStack_27b8;
  uint uStack_27ac;
  fdb_kvs_info fStack_27a8;
  timeval tStack_2778;
  fdb_kvs_config fStack_2768;
  undefined1 auStack_2750 [80];
  docio_handle *pdStack_2700;
  btreeblk_handle *pbStack_26f8;
  btree_blk_ops *pbStack_26f0;
  filemgr_ops *pfStack_26e8;
  fdb_config fStack_26e0;
  undefined1 uStack_2509;
  fdb_kvs_handle fStack_2508;
  fdb_kvs_handle *pfStack_2300;
  char *pcStack_22f8;
  char *pcStack_22f0;
  fdb_kvs_handle *pfStack_22e8;
  fdb_kvs_handle *pfStack_22e0;
  fdb_file_handle *pfStack_22d8;
  timeval tStack_22d0;
  undefined1 auStack_22c0 [536];
  undefined1 auStack_20a8 [375];
  undefined1 uStack_1f31;
  fdb_kvs_handle *pfStack_1ea8;
  undefined8 uStack_1e90;
  fdb_kvs_handle *pfStack_1e68;
  fdb_kvs_handle *pfStack_1e60;
  fdb_kvs_handle *pfStack_1e58;
  fdb_kvs_handle *pfStack_1e50;
  fdb_kvs_handle *pfStack_1e48;
  code *pcStack_1e40;
  fdb_kvs_handle *pfStack_1e38;
  fdb_file_handle *pfStack_1e30;
  fdb_kvs_handle *pfStack_1e28;
  fdb_kvs_handle *pfStack_1e20;
  fdb_kvs_config fStack_1e18;
  timeval tStack_1e00;
  fdb_file_info fStack_1df0;
  fdb_kvs_info fStack_1da8;
  undefined1 auStack_1d78 [512];
  fdb_kvs_handle fStack_1b78;
  size_t sStack_1970;
  char *pcStack_1968;
  char *pcStack_1960;
  code *pcStack_1958;
  fdb_kvs_handle *pfStack_1950;
  fdb_file_handle *pfStack_1948;
  fdb_kvs_info fStack_1940;
  timeval tStack_1910;
  fdb_kvs_config fStack_1900;
  fdb_file_info fStack_18e8;
  char acStack_18a0 [256];
  char acStack_17a0 [511];
  undefined1 uStack_15a1;
  fdb_config fStack_13a0;
  char *pcStack_12a8;
  fdb_config *pfStack_12a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1298;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1290;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1288;
  code *pcStack_1280;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1278;
  fdb_file_handle *pfStack_1270;
  size_t sStack_1268;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1260;
  kvs_info *pkStack_1258;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1250;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1248;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1240;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1238;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1230;
  timeval tStack_1228;
  undefined1 auStack_1218 [24];
  fdb_file_info fStack_1200;
  fdb_config fStack_11b8;
  fdb_config fStack_10b8;
  fdb_config *pfStack_fc0;
  fdb_kvs_handle *pfStack_fb8;
  fdb_kvs_handle *pfStack_fb0;
  fdb_config *pfStack_fa8;
  snap_handle *psStack_fa0;
  code *pcStack_f98;
  fdb_kvs_handle *pfStack_f90;
  fdb_file_handle *pfStack_f88;
  fdb_kvs_handle *pfStack_f80;
  fdb_config *pfStack_f78;
  size_t sStack_f70;
  fdb_kvs_config fStack_f68;
  timeval tStack_f50;
  undefined1 auStack_f40 [280];
  undefined8 uStack_e28;
  fdb_config *pfStack_e00;
  fdb_kvs_handle *pfStack_df8;
  fdb_config *pfStack_df0;
  snap_handle *psStack_de8;
  code *pcStack_de0;
  fdb_kvs_handle *pfStack_dd8;
  fdb_file_handle *pfStack_dd0;
  fdb_kvs_handle *pfStack_dc8;
  fdb_kvs_config fStack_dc0;
  undefined1 auStack_da8 [40];
  undefined1 auStack_d80 [119];
  uint8_t uStack_d09;
  undefined8 uStack_c68;
  ulong uStack_c40;
  fdb_kvs_handle *pfStack_c38;
  fdb_kvs_handle *pfStack_c30;
  fdb_config *pfStack_c28;
  snap_handle *psStack_c20;
  code *pcStack_c18;
  fdb_kvs_handle *pfStack_c10;
  fdb_file_handle *pfStack_c08;
  fdb_kvs_handle *pfStack_c00;
  fdb_config *pfStack_bf8;
  size_t sStack_bf0;
  fdb_kvs_config fStack_be8;
  timeval tStack_bd0;
  undefined1 auStack_bc0 [280];
  uint8_t auStack_aa8 [40];
  char acStack_a80 [264];
  fdb_kvs_handle *pfStack_978;
  fdb_kvs_handle *pfStack_970;
  fdb_kvs_handle *pfStack_968;
  fdb_kvs_handle *pfStack_960;
  snap_handle *psStack_958;
  code *pcStack_950;
  fdb_kvs_handle *pfStack_948;
  fdb_file_handle *pfStack_940;
  fdb_kvs_handle *pfStack_938;
  void *pvStack_930;
  undefined1 auStack_928 [56];
  timeval tStack_8f0;
  undefined1 auStack_8e0 [119];
  undefined1 uStack_869;
  undefined8 uStack_7c8;
  fdb_config *pfStack_7a0;
  atomic<unsigned_long> aStack_798;
  fdb_kvs_handle *pfStack_790;
  fdb_kvs_handle *pfStack_788;
  snap_handle *psStack_780;
  code *pcStack_778;
  fdb_file_handle *pfStack_768;
  fdb_kvs_handle *pfStack_760;
  fdb_kvs_handle *pfStack_758;
  fdb_kvs_config fStack_750;
  timeval tStack_738;
  undefined1 auStack_728 [119];
  undefined1 uStack_6b1;
  undefined8 uStack_610;
  fdb_kvs_handle *pfStack_5e8;
  fdb_kvs_handle *pfStack_5e0;
  snap_handle *psStack_5d8;
  code *pcStack_5d0;
  fdb_kvs_handle *local_5c0;
  fdb_file_handle *local_5b8;
  fdb_kvs_handle *local_5b0;
  size_t local_5a8;
  fdb_kvs_handle *local_5a0;
  timeval local_598;
  fdb_kvs_config local_588;
  undefined1 local_570 [583];
  undefined1 local_329;
  undefined1 local_328 [559];
  undefined1 local_f9;
  undefined8 local_70;
  undefined8 local_58;
  
  pcStack_5d0 = (code *)0x10b5b2;
  gettimeofday(&local_598,(__timezone_ptr_t)0x0);
  pcStack_5d0 = (code *)0x10b5b7;
  memleak_start();
  pcStack_5d0 = (code *)0x10b5c4;
  fdb_get_default_kvs_config();
  pcStack_5d0 = (code *)0x10b5d4;
  fdb_get_default_config();
  local_f9 = 0;
  local_70 = 0x41;
  local_58 = 10;
  pcStack_5d0 = (code *)0x10b5fb;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_5d0 = (code *)0x10b612;
  fdb_open(&local_5b8,"./staleblktest1",(fdb_config *)(local_328 + 0x200));
  pcStack_5d0 = (code *)0x10b622;
  fdb_kvs_open_default(local_5b8,&local_5c0,&local_588);
  iVar4 = (int)local_58 * 2;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  pcVar26 = (char *)(ulong)(uint)-iVar4;
  pcVar14 = (char *)0x1;
  pcVar22 = local_570 + 0x48;
  handle._M_i = (__int_type)local_328;
  do {
    if (-iVar4 + (int)pcVar14 == 1) goto LAB_0010b6d2;
    pcStack_5d0 = (code *)0x10b666;
    memset(pcVar22,0x6b,0x1ff);
    local_329 = 0;
    pcStack_5d0 = (code *)0x10b681;
    sprintf((char *)handle._M_i,"orig_body%d",pcVar14);
    pfVar7 = local_5c0;
    pcStack_5d0 = (code *)0x10b68e;
    keylen = strlen(pcVar22);
    pcStack_5d0 = (code *)0x10b699;
    sVar6 = strlen((char *)handle._M_i);
    pcStack_5d0 = (code *)0x10b6ae;
    fVar2 = fdb_set_kv(pfVar7,pcVar22,keylen,(void *)handle._M_i,sVar6 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba1b;
    pcStack_5d0 = (code *)0x10b6c5;
    fVar2 = fdb_commit(local_5b8,'\x01');
    pcVar14 = (char *)(ulong)((int)pcVar14 + 1);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  pcStack_5d0 = (code *)0x10b6d2;
  reuse_with_snapshot_test();
LAB_0010b6d2:
  pcVar14 = local_570 + 0x48;
  keylen = 0;
  pcVar22 = local_328;
  pcVar26 = local_570;
  do {
    pcStack_5d0 = (code *)0x10b6fb;
    memset(pcVar14,0x72,0x1ff);
    local_329 = 0;
    pcStack_5d0 = (code *)0x10b715;
    memset(pcVar22,0x79,0x1ff);
    handle._M_i = (__int_type)local_5c0;
    local_328[0x1ff] = 0;
    pcStack_5d0 = (code *)0x10b72a;
    pfVar7 = (fdb_kvs_handle *)strlen(pcVar14);
    pcStack_5d0 = (code *)0x10b735;
    sVar6 = strlen(pcVar22);
    pcStack_5d0 = (code *)0x10b74a;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar14,(size_t)pfVar7,pcVar22,sVar6 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010ba0d:
      pcStack_5d0 = (code *)0x10ba14;
      reuse_with_snapshot_test();
      goto LAB_0010ba14;
    }
    pcStack_5d0 = (code *)0x10b75f;
    fVar2 = fdb_get_file_info(local_5b8,(fdb_file_info *)pcVar26);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_5d0 = (code *)0x10ba0d;
      reuse_with_snapshot_test();
      goto LAB_0010ba0d;
    }
  } while ((ulong)local_570._40_8_ < 0x1000000);
  pcStack_5d0 = (code *)0x10b783;
  sVar3 = sb_check_block_reusing(local_5c0);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010ba29;
  pcStack_5d0 = (code *)0x10b7a0;
  fVar2 = fdb_snapshot_open(local_5c0,&local_5b0,8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba2e;
  pcStack_5d0 = (code *)0x10b7b7;
  fVar2 = fdb_commit(local_5b8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba35;
  pcVar14 = "key%d";
  pcVar22 = local_570 + 0x48;
  pcVar26 = local_328;
  keylen = 0;
  do {
    pcStack_5d0 = (code *)0x10b7e7;
    sprintf(pcVar22,"key%d",keylen);
    pcStack_5d0 = (code *)0x10b7f9;
    memset(pcVar26,0x7a,0x1ff);
    handle._M_i = (__int_type)local_5c0;
    local_328[0x1ff] = 0;
    pcStack_5d0 = (code *)0x10b80e;
    pfVar7 = (fdb_kvs_handle *)strlen(pcVar22);
    pcStack_5d0 = (code *)0x10b819;
    sVar6 = strlen(pcVar26);
    pcStack_5d0 = (code *)0x10b82d;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar22,(size_t)pfVar7,pcVar26,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba14;
    pcStack_5d0 = (code *)0x10b83f;
    sVar3 = sb_check_block_reusing(local_5c0);
    keylen = (size_t)((int)keylen + 1);
  } while (sVar3 != SBD_NONE);
  keylen = (size_t)(uint)((int)local_58 * 2);
  if (0 < (int)local_58 * 2) {
    pcVar14 = local_570 + 0x48;
    do {
      pcStack_5d0 = (code *)0x10b86c;
      memset(pcVar14,0x6b,0x1ff);
      pcVar22 = (char *)local_5c0;
      local_329 = 0;
      pcStack_5d0 = (code *)0x10b881;
      sVar6 = strlen(pcVar14);
      pcStack_5d0 = (code *)0x10b88f;
      fVar2 = fdb_del_kv((fdb_kvs_handle *)pcVar22,pcVar14,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba22;
      uVar18 = (int)keylen - 1;
      keylen = (size_t)uVar18;
    } while (uVar18 != 0);
  }
  pcStack_5d0 = (code *)0x10b8aa;
  fVar2 = fdb_commit(local_5b8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba3c;
  pcVar14 = local_570 + 0x48;
  pcStack_5d0 = (code *)0x10b8cc;
  memset(pcVar14,0x6b,0x1ff);
  local_329 = 0;
  pcStack_5d0 = (code *)0x10b8ee;
  sprintf(local_328,"orig_body%d",8);
  pcVar22 = (char *)local_5c0;
  pcStack_5d0 = (code *)0x10b8fb;
  sVar6 = strlen(pcVar14);
  pcStack_5d0 = (code *)0x10b913;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar22,pcVar14,sVar6,&local_5a0,&local_5a8);
  pfVar12 = local_5b0;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010ba43;
  pcVar22 = local_570 + 0x48;
  pcStack_5d0 = (code *)0x10b931;
  sVar6 = strlen(pcVar22);
  pcStack_5d0 = (code *)0x10b949;
  fVar2 = fdb_get_kv(pfVar12,pcVar22,sVar6,&local_5a0,&local_5a8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba48;
  pcStack_5d0 = (code *)0x10b96b;
  iVar4 = bcmp(local_5a0,local_328,local_5a8);
  pfVar12 = local_5a0;
  if (iVar4 != 0) goto LAB_0010ba4f;
  pcStack_5d0 = (code *)0x10b97b;
  fVar2 = fdb_free_block(local_5a0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba5f;
  pcStack_5d0 = (code *)0x10b98d;
  fVar2 = fdb_kvs_close(local_5b0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba66;
  pcStack_5d0 = (code *)0x10b99f;
  fVar2 = fdb_kvs_close(local_5c0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ba6d;
  pcStack_5d0 = (code *)0x10b9b1;
  fVar2 = fdb_close(local_5b8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_5d0 = (code *)0x10b9be;
    fdb_shutdown();
    pcStack_5d0 = (code *)0x10b9c3;
    memleak_end();
    pcVar22 = "%s PASSED\n";
    if (reuse_with_snapshot_test()::__test_pass != '\0') {
      pcVar22 = "%s FAILED\n";
    }
    pcStack_5d0 = (code *)0x10b9f4;
    fprintf(_stderr,pcVar22,"reuse with snapshot test");
    return;
  }
  goto LAB_0010ba74;
LAB_0010ba14:
  pcStack_5d0 = (code *)0x10ba1b;
  reuse_with_snapshot_test();
LAB_0010ba1b:
  pcStack_5d0 = (code *)0x10ba22;
  reuse_with_snapshot_test();
LAB_0010ba22:
  pcStack_5d0 = (code *)0x10ba29;
  reuse_with_snapshot_test();
LAB_0010ba29:
  pcStack_5d0 = (code *)0x10ba2e;
  reuse_with_snapshot_test();
LAB_0010ba2e:
  pcStack_5d0 = (code *)0x10ba35;
  reuse_with_snapshot_test();
LAB_0010ba35:
  pcStack_5d0 = (code *)0x10ba3c;
  reuse_with_snapshot_test();
LAB_0010ba3c:
  pcStack_5d0 = (code *)0x10ba43;
  reuse_with_snapshot_test();
LAB_0010ba43:
  pfVar12 = (fdb_kvs_handle *)pcVar14;
  pcStack_5d0 = (code *)0x10ba48;
  reuse_with_snapshot_test();
LAB_0010ba48:
  pcStack_5d0 = (code *)0x10ba4f;
  reuse_with_snapshot_test();
LAB_0010ba4f:
  pcStack_5d0 = (code *)0x10ba5f;
  reuse_with_snapshot_test();
LAB_0010ba5f:
  pcStack_5d0 = (code *)0x10ba66;
  reuse_with_snapshot_test();
LAB_0010ba66:
  pcStack_5d0 = (code *)0x10ba6d;
  reuse_with_snapshot_test();
LAB_0010ba6d:
  pcStack_5d0 = (code *)0x10ba74;
  reuse_with_snapshot_test();
LAB_0010ba74:
  pcStack_5d0 = verify_minimum_num_keeping_headers_param_test;
  reuse_with_snapshot_test();
  pcStack_778 = (code *)0x10ba8d;
  pfStack_5e8 = pfVar12;
  pfStack_5e0 = (fdb_kvs_handle *)pcVar22;
  psStack_5d8 = (snap_handle *)pcVar26;
  pcStack_5d0 = (code *)keylen;
  memleak_start();
  pcStack_778 = (code *)0x10ba99;
  gettimeofday(&tStack_738,(__timezone_ptr_t)0x0);
  pfVar15 = (fdb_config *)(auStack_728 + 0x48);
  pcStack_778 = (code *)0x10baa9;
  fdb_get_default_config();
  pcStack_778 = (code *)0x10bab3;
  fdb_get_default_kvs_config();
  pcStack_778 = (code *)0x10babf;
  system("rm -rf  staleblktest* > errorlog.txt");
  uStack_6b1 = 0;
  uStack_610 = 0;
  pcStack_778 = (code *)0x10bae2;
  fVar2 = fdb_open(&pfStack_768,"./staleblktest1",pfVar15);
  if (fVar2 == FDB_RESULT_SUCCESS) {
LAB_0010bcdd:
    pcStack_778 = (code *)0x10bce2;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bce2:
    pcStack_778 = (code *)0x10bce9;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bce9:
    pcStack_778 = (code *)0x10bcf0;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcf0:
    pcStack_778 = (code *)0x10bcf7;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcf7:
    pcStack_778 = (code *)0x10bcfe;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bcfe:
    pcStack_778 = (code *)0x10bd05;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bd05:
    pcStack_778 = (code *)0x10bd0a;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bd0a:
    pcStack_778 = (code *)0x10bd11;
    verify_minimum_num_keeping_headers_param_test();
LAB_0010bd11:
    pcStack_778 = (code *)0x10bd18;
    verify_minimum_num_keeping_headers_param_test();
  }
  else {
    uStack_610 = 1;
    pcStack_778 = (code *)0x10bb0e;
    fVar2 = fdb_open(&pfStack_768,"./staleblktest1",(fdb_config *)(auStack_728 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bce2;
    pcStack_778 = (code *)0x10bb31;
    fVar2 = fdb_kvs_open(pfStack_768,&pfStack_760,"num_keep",&fStack_750);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bce9;
    keylen = 10;
    pfVar15 = (fdb_config *)0x148599;
    pcVar22 = "val";
    do {
      pcStack_778 = (code *)0x10bb67;
      fVar2 = fdb_set_kv(pfStack_760,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010bcc8:
        pcStack_778 = (code *)0x10bccf;
        verify_minimum_num_keeping_headers_param_test();
        goto LAB_0010bccf;
      }
      pcStack_778 = (code *)0x10bb7e;
      fVar2 = fdb_commit(pfStack_768,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_778 = (code *)0x10bcc8;
        verify_minimum_num_keeping_headers_param_test();
        goto LAB_0010bcc8;
      }
      uVar18 = (int)keylen - 1;
      keylen = (size_t)uVar18;
    } while (uVar18 != 0);
    pcStack_778 = (code *)0x10bb9e;
    fVar2 = fdb_snapshot_open(pfStack_760,&pfStack_758,9);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcf0;
    pfVar15 = (fdb_config *)0x148599;
    pcVar22 = "val";
    pcVar26 = auStack_728;
    do {
      pcStack_778 = (code *)0x10bbd4;
      fVar2 = fdb_set_kv(pfStack_760,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcd6;
      pcStack_778 = (code *)0x10bbe9;
      fVar2 = fdb_get_file_info(pfStack_768,(fdb_file_info *)pcVar26);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bccf;
    } while ((ulong)auStack_728._40_8_ < 0x1000001);
    pcStack_778 = (code *)0x10bc06;
    fVar2 = fdb_kvs_close(pfStack_758);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcf7;
    pcStack_778 = (code *)0x10bc1d;
    fVar2 = fdb_commit(pfStack_768,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bcfe;
    pcStack_778 = (code *)0x10bc39;
    fVar2 = fdb_snapshot_open(pfStack_760,&pfStack_758,9);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010bd05;
    pcStack_778 = (code *)0x10bc56;
    fVar2 = fdb_snapshot_open(pfStack_760,&pfStack_758,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bd0a;
    pcStack_778 = (code *)0x10bc68;
    fVar2 = fdb_close(pfStack_768);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bd11;
    pcStack_778 = (code *)0x10bc75;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_778 = (code *)0x10bc82;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (verify_minimum_num_keeping_headers_param_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_778 = (code *)0x10bcb3;
      fprintf(_stderr,pcVar22,"verify minimum num keeping headers param test");
      return;
    }
  }
  pcStack_778 = verify_high_num_keeping_headers_param_test;
  verify_minimum_num_keeping_headers_param_test();
  pcStack_950 = (code *)0x10bd35;
  pfStack_7a0 = pfVar15;
  aStack_798.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)handle._M_i;
  pfStack_790 = pfVar7;
  pfStack_788 = (fdb_kvs_handle *)pcVar22;
  psStack_780 = (snap_handle *)pcVar26;
  pcStack_778 = (code *)keylen;
  memleak_start();
  pcStack_950 = (code *)0x10bd41;
  gettimeofday(&tStack_8f0,(__timezone_ptr_t)0x0);
  pcVar14 = auStack_8e0 + 0x48;
  pcStack_950 = (code *)0x10bd51;
  fdb_get_default_config();
  pcStack_950 = (code *)0x10bd5b;
  fdb_get_default_kvs_config();
  pcStack_950 = (code *)0x10bd67;
  system("rm -rf  staleblktest* > errorlog.txt");
  uStack_869 = 0;
  uStack_7c8._0_4_ = 100;
  uStack_7c8._4_1_ = false;
  uStack_7c8._5_3_ = 0;
  pcStack_950 = (code *)0x10bd8a;
  fVar2 = fdb_open(&pfStack_940,"./staleblktest1",(fdb_config *)pcVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_950 = (code *)0x10bdab;
    fVar2 = fdb_kvs_open(pfStack_940,&pfStack_948,"num_keep",(fdb_kvs_config *)(auStack_928 + 0x20))
    ;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c000;
    pfVar7 = (fdb_kvs_handle *)0x0;
    pcVar14 = "key";
    pcVar22 = "val";
    pcVar26 = auStack_8e0;
    do {
      pcStack_950 = (code *)0x10bde3;
      fVar2 = fdb_set_kv(pfStack_948,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010bfe4:
        pcStack_950 = (code *)0x10bfeb;
        verify_high_num_keeping_headers_param_test();
        goto LAB_0010bfeb;
      }
      pcStack_950 = (code *)0x10bdf8;
      fVar2 = fdb_get_file_info(pfStack_940,(fdb_file_info *)pcVar26);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_950 = (code *)0x10bfe4;
        verify_high_num_keeping_headers_param_test();
        goto LAB_0010bfe4;
      }
      pfVar7 = (fdb_kvs_handle *)((long)&pfVar7[-1].bub_ctx.handle + 7);
    } while ((ulong)auStack_8e0._40_8_ < 0x1000001);
    pcStack_950 = (code *)0x10be20;
    fVar2 = fdb_commit(pfStack_940,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c007;
    pcVar14 = "key%d";
    pcVar22 = auStack_928;
    pcVar26 = "reu";
    keylen = 0;
    do {
      pcStack_950 = (code *)0x10be4c;
      sprintf(pcVar22,"key%d",keylen);
      handle._M_i = (__int_type)pfStack_948;
      pcStack_950 = (code *)0x10be58;
      sVar6 = strlen(pcVar22);
      pcStack_950 = (code *)0x10be6f;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar22,sVar6,"reu",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bff2;
      pcStack_950 = (code *)0x10be86;
      fVar2 = fdb_commit(pfStack_940,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfeb;
      uVar18 = (int)keylen + 1;
      keylen = (size_t)uVar18;
    } while (uVar18 != 100);
    pcVar14 = "key";
    pcVar22 = "val";
    keylen = (ulong)pfVar7 & 0xffffffff;
    do {
      uVar18 = (int)keylen + 1;
      keylen = (size_t)uVar18;
      if (uVar18 == 0) goto LAB_0010becf;
      pcStack_950 = (code *)0x10bec4;
      fVar2 = fdb_set_kv(pfStack_948,"key",4,"val",4);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    pcStack_950 = (code *)0x10becf;
    verify_high_num_keeping_headers_param_test();
LAB_0010becf:
    pcStack_950 = (code *)0x10bede;
    fVar2 = fdb_commit(pfStack_940,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c00e;
    pcStack_950 = (code *)0x10befa;
    fVar2 = fdb_snapshot_open(pfStack_948,&pfStack_938,-(long)pfVar7);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c015;
    pcStack_950 = (code *)0x10bf19;
    fVar2 = fdb_snapshot_open(pfStack_948,&pfStack_938,1 - (long)pfVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c01a;
    pcVar22 = auStack_928;
    pcStack_950 = (code *)0x10bf32;
    sVar6 = strlen(pcVar22);
    pcStack_950 = (code *)0x10bf4a;
    fVar2 = fdb_get_kv(pfStack_948,pcVar22,sVar6,&pvStack_930,(size_t *)(auStack_928 + 0x18));
    pcVar14 = (char *)pfStack_948;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c021;
    pcStack_950 = (code *)0x10bf5c;
    fVar2 = fdb_free_block(pvStack_930);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c028;
    pcStack_950 = (code *)0x10bf6e;
    fVar2 = fdb_kvs_close(pfStack_938);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c02f;
    pcStack_950 = (code *)0x10bf80;
    fVar2 = fdb_close(pfStack_940);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c036;
    pcStack_950 = (code *)0x10bf8d;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_950 = (code *)0x10bf9a;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (verify_high_num_keeping_headers_param_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_950 = (code *)0x10bfcb;
      fprintf(_stderr,pcVar22,"verify high num keeping headers param test");
      return;
    }
  }
  else {
LAB_0010bff9:
    pcStack_950 = (code *)0x10c000;
    verify_high_num_keeping_headers_param_test();
LAB_0010c000:
    pcStack_950 = (code *)0x10c007;
    verify_high_num_keeping_headers_param_test();
LAB_0010c007:
    pcStack_950 = (code *)0x10c00e;
    verify_high_num_keeping_headers_param_test();
LAB_0010c00e:
    pcStack_950 = (code *)0x10c015;
    verify_high_num_keeping_headers_param_test();
LAB_0010c015:
    pcStack_950 = (code *)0x10c01a;
    verify_high_num_keeping_headers_param_test();
LAB_0010c01a:
    pcStack_950 = (code *)0x10c021;
    verify_high_num_keeping_headers_param_test();
LAB_0010c021:
    pcStack_950 = (code *)0x10c028;
    verify_high_num_keeping_headers_param_test();
LAB_0010c028:
    pcStack_950 = (code *)0x10c02f;
    verify_high_num_keeping_headers_param_test();
LAB_0010c02f:
    pcStack_950 = (code *)0x10c036;
    verify_high_num_keeping_headers_param_test();
LAB_0010c036:
    pcStack_950 = (code *)0x10c03d;
    verify_high_num_keeping_headers_param_test();
    fVar2 = extraout_EAX;
  }
  uVar20 = (ulong)(uint)fVar2;
  pcStack_950 = snapshot_before_block_reuse_test;
  verify_high_num_keeping_headers_param_test();
  pcStack_c18 = (code *)0x10c05c;
  pfStack_978 = (fdb_kvs_handle *)pcVar14;
  pfStack_970 = (fdb_kvs_handle *)handle._M_i;
  pfStack_968 = pfVar7;
  pfStack_960 = (fdb_kvs_handle *)pcVar22;
  psStack_958 = (snap_handle *)pcVar26;
  pcStack_950 = (code *)keylen;
  memleak_start();
  pcStack_c18 = (code *)0x10c068;
  gettimeofday(&tStack_bd0,(__timezone_ptr_t)0x0);
  pfVar15 = (fdb_config *)(auStack_bc0 + 0x48);
  pcStack_c18 = (code *)0x10c078;
  fdb_get_default_config();
  pcStack_c18 = (code *)0x10c082;
  fdb_get_default_kvs_config();
  pcStack_c18 = (code *)0x10c08e;
  system("rm -rf  staleblktest* > errorlog.txt");
  auStack_aa8[0] = '\x01';
  auStack_aa8[1] = '\0';
  auStack_aa8[2] = '\0';
  auStack_aa8[3] = '\0';
  auStack_aa8[4] = '\0';
  auStack_aa8[5] = '\0';
  auStack_aa8[6] = '\0';
  auStack_aa8[7] = '\0';
  pcStack_c18 = (code *)0x10c0ad;
  fVar2 = fdb_open(&pfStack_c08,"./staleblktest1",pfVar15);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_c18 = (code *)0x10c0c7;
    fVar2 = fdb_kvs_open_default(pfStack_c08,&pfStack_c10,&fStack_be8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3bd;
    pcStack_c18 = (code *)0x10c0f1;
    fVar2 = fdb_set_kv(pfStack_c10,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3c4;
    pcStack_c18 = (code *)0x10c108;
    fVar2 = fdb_commit(pfStack_c08,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3cb;
    ptr_handle = &pfStack_c00;
    cVar13 = (char)(uVar20 & 0xffffffff);
    pfVar12 = pfStack_c10;
    if (cVar13 == '\0') {
LAB_0010c134:
      pcStack_c18 = (code *)0x10c13e;
      fVar2 = fdb_snapshot_open(pfVar12,ptr_handle,1);
      pcVar22 = (char *)pfVar15;
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c146;
      goto LAB_0010c40e;
    }
    pcStack_c18 = (code *)0x10c129;
    fVar2 = fdb_snapshot_open(pfStack_c10,ptr_handle,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfVar12 = (fdb_kvs_handle *)(ulong)(uint)fVar2;
      pcStack_c18 = (code *)0x10c134;
      snapshot_before_block_reuse_test();
      goto LAB_0010c134;
    }
LAB_0010c146:
    keylen = 0;
    handle._M_i = (__int_type)auStack_bc0;
    do {
      pcStack_c18 = (code *)0x10c175;
      fVar2 = fdb_set_kv(pfStack_c10,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a1;
      pcStack_c18 = (code *)0x10c18a;
      fVar2 = fdb_get_file_info(pfStack_c08,(fdb_file_info *)handle._M_i);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c39a;
      uVar18 = (int)keylen + 1;
      keylen = (size_t)uVar18;
    } while ((ulong)auStack_bc0._40_8_ < (fdb_file_handle *)0x1000001);
    handle._M_i = 0;
    pfVar15 = (fdb_config *)0x148599;
    pcVar26 = "val";
    do {
      pfVar7 = (fdb_kvs_handle *)(ulong)uVar18;
      do {
        pcStack_c18 = (code *)0x10c1cd;
        fVar2 = fdb_set_kv(pfStack_c10,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_c18 = (code *)0x10c39a;
          snapshot_before_block_reuse_test();
          goto LAB_0010c39a;
        }
        uVar23 = (int)pfVar7 - 1;
        pfVar7 = (fdb_kvs_handle *)(ulong)uVar23;
      } while (uVar23 != 0);
      pcStack_c18 = (code *)0x10c1e9;
      fVar2 = fdb_commit(pfStack_c08,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a8;
      uVar23 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar23;
    } while (uVar23 != 5);
    pcStack_c18 = (code *)0x10c203;
    sVar3 = sb_check_block_reusing(pfStack_c10);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010c3d2;
    pcStack_c18 = (code *)0x10c22c;
    fVar2 = fdb_get_kv(pfStack_c00,"key",4,&pfStack_bf8,&sStack_bf0);
    pcVar22 = (char *)pfStack_bf8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3d7;
    pcStack_c18 = (code *)0x10c24d;
    iVar4 = bcmp(pfStack_bf8,"snp",sStack_bf0);
    if (iVar4 != 0) goto LAB_0010c3de;
    pcStack_c18 = (code *)0x10c25f;
    fVar2 = fdb_kvs_close(pfStack_c00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3e6;
    pcVar22 = "key";
    pcVar26 = "val";
    do {
      pcStack_c18 = (code *)0x10c28f;
      fVar2 = fdb_set_kv(pfStack_c10,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3af;
      uVar18 = (int)keylen - 1;
      keylen = (size_t)uVar18;
    } while (uVar18 != 0);
    pcStack_c18 = (code *)0x10c2aa;
    fVar2 = fdb_commit(pfStack_c08,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3ed;
    pcStack_c18 = (code *)0x10c2c5;
    fVar2 = fdb_snapshot_open(pfStack_c10,&pfStack_c00,1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c2df:
      if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c3f4;
      pcStack_c18 = (code *)0x10c2f2;
      fVar2 = fdb_free_block(pfStack_bf8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3f9;
      pcStack_c18 = (code *)0x10c303;
      fVar2 = fdb_kvs_close(pfStack_c10);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c400;
      pcStack_c18 = (code *)0x10c315;
      fVar2 = fdb_close(pfStack_c08);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_c18 = (code *)0x10c322;
        fdb_shutdown();
        pcStack_c18 = (code *)0x10c327;
        memleak_end();
        pcVar22 = "disk snapshot";
        if (cVar13 != '\0') {
          pcVar22 = "in-mem snapshot";
        }
        pcStack_c18 = (code *)0x10c354;
        sprintf(acStack_a80,"snapshot before block reuse test %s",pcVar22);
        pcVar22 = "%s PASSED\n";
        if (snapshot_before_block_reuse_test(bool)::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        pcStack_c18 = (code *)0x10c381;
        fprintf(_stderr,pcVar22,acStack_a80);
        return;
      }
      goto LAB_0010c407;
    }
    pcStack_c18 = (code *)0x10c2d3;
    fVar5 = fdb_kvs_close(pfStack_c00);
    fVar2 = FDB_RESULT_SUCCESS;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010c2df;
  }
  else {
LAB_0010c3b6:
    pcStack_c18 = (code *)0x10c3bd;
    snapshot_before_block_reuse_test();
LAB_0010c3bd:
    pcStack_c18 = (code *)0x10c3c4;
    snapshot_before_block_reuse_test();
LAB_0010c3c4:
    pcStack_c18 = (code *)0x10c3cb;
    snapshot_before_block_reuse_test();
LAB_0010c3cb:
    pcStack_c18 = (code *)0x10c3d2;
    snapshot_before_block_reuse_test();
LAB_0010c3d2:
    pcStack_c18 = (code *)0x10c3d7;
    snapshot_before_block_reuse_test();
LAB_0010c3d7:
    pcVar22 = (char *)pfVar15;
    pcStack_c18 = (code *)0x10c3de;
    snapshot_before_block_reuse_test();
LAB_0010c3de:
    pcStack_c18 = (code *)0x10c3e6;
    snapshot_before_block_reuse_test();
LAB_0010c3e6:
    pcStack_c18 = (code *)0x10c3ed;
    snapshot_before_block_reuse_test();
LAB_0010c3ed:
    pcStack_c18 = (code *)0x10c3f4;
    snapshot_before_block_reuse_test();
LAB_0010c3f4:
    pcStack_c18 = (code *)0x10c3f9;
    snapshot_before_block_reuse_test();
LAB_0010c3f9:
    pcStack_c18 = (code *)0x10c400;
    snapshot_before_block_reuse_test();
LAB_0010c400:
    pcStack_c18 = (code *)0x10c407;
    snapshot_before_block_reuse_test();
LAB_0010c407:
    pcStack_c18 = (code *)0x10c40e;
    snapshot_before_block_reuse_test();
LAB_0010c40e:
    pcStack_c18 = (code *)0x10c415;
    snapshot_before_block_reuse_test();
  }
  pcStack_c18 = snapshot_after_block_reuse_test;
  snapshot_before_block_reuse_test();
  pcStack_de0 = (code *)0x10c430;
  uStack_c40 = uVar20 & 0xffffffff;
  pfStack_c38 = (fdb_kvs_handle *)handle._M_i;
  pfStack_c30 = pfVar7;
  pfStack_c28 = (fdb_config *)pcVar22;
  psStack_c20 = (snap_handle *)pcVar26;
  pcStack_c18 = (code *)keylen;
  memleak_start();
  pcStack_de0 = (code *)0x10c43c;
  gettimeofday((timeval *)(auStack_da8 + 0x18),(__timezone_ptr_t)0x0);
  pcVar14 = auStack_d80 + 0x48;
  pcStack_de0 = (code *)0x10c44c;
  fdb_get_default_config();
  pcStack_de0 = (code *)0x10c456;
  fdb_get_default_kvs_config();
  pcStack_de0 = (code *)0x10c462;
  system("rm -rf  staleblktest* > errorlog.txt");
  uStack_d09 = '\0';
  uStack_c68 = 5;
  pcStack_de0 = (code *)0x10c485;
  fVar2 = fdb_open(&pfStack_dd0,"./staleblktest1",(fdb_config *)pcVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_de0 = (code *)0x10c4a6;
    fVar2 = fdb_kvs_open(pfStack_dd0,&pfStack_dd8,"num_keep",&fStack_dc0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6c3;
    pfVar7 = (fdb_kvs_handle *)0x0;
    pcVar14 = "key";
    pcVar22 = "val";
    pcVar26 = auStack_d80;
    do {
      pcStack_de0 = (code *)0x10c4de;
      fVar2 = fdb_set_kv(pfStack_dd8,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c6a7:
        pcStack_de0 = (code *)0x10c6ae;
        snapshot_after_block_reuse_test();
        goto LAB_0010c6ae;
      }
      pcStack_de0 = (code *)0x10c4f3;
      fVar2 = fdb_get_file_info(pfStack_dd0,(fdb_file_info *)pcVar26);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_de0 = (code *)0x10c6a7;
        snapshot_after_block_reuse_test();
        goto LAB_0010c6a7;
      }
      pfVar7 = (fdb_kvs_handle *)((long)&pfVar7[-1].bub_ctx.handle + 7);
    } while ((ulong)auStack_d80._40_8_ < 0x1000001);
    pcStack_de0 = (code *)0x10c51b;
    fVar2 = fdb_commit(pfStack_dd0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6ca;
    pcVar14 = "key%d";
    pcVar22 = auStack_da8;
    pcVar26 = "reu";
    keylen = 0;
    do {
      pcStack_de0 = (code *)0x10c547;
      sprintf(pcVar22,"key%d",keylen);
      handle._M_i = (__int_type)pfStack_dd8;
      pcStack_de0 = (code *)0x10c553;
      sVar6 = strlen(pcVar22);
      pcStack_de0 = (code *)0x10c56a;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar22,sVar6,"reu",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b5;
      pcStack_de0 = (code *)0x10c581;
      fVar2 = fdb_commit(pfStack_dd0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6ae;
      uVar18 = (int)keylen + 1;
      keylen = (size_t)uVar18;
    } while (uVar18 != 10);
    pcVar14 = "key";
    pcVar22 = "val";
    keylen = (ulong)pfVar7 & 0xffffffff;
    do {
      uVar18 = (int)keylen + 1;
      keylen = (size_t)uVar18;
      if (uVar18 == 0) goto LAB_0010c5ca;
      pcStack_de0 = (code *)0x10c5bf;
      fVar2 = fdb_set_kv(pfStack_dd8,"key",4,"val",4);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    pcStack_de0 = (code *)0x10c5ca;
    snapshot_after_block_reuse_test();
LAB_0010c5ca:
    pcStack_de0 = (code *)0x10c5d9;
    fVar2 = fdb_commit(pfStack_dd0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d1;
    pcStack_de0 = (code *)0x10c5f7;
    fVar2 = fdb_snapshot_open(pfStack_dd8,&pfStack_dc8,6 - (long)pfVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d8;
    pcStack_de0 = (code *)0x10c609;
    fVar2 = fdb_kvs_close(pfStack_dc8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6df;
    pcStack_de0 = (code *)0x10c627;
    fVar2 = fdb_snapshot_open(pfStack_dd8,&pfStack_dc8,5 - (long)pfVar7);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c6e6;
    pcStack_de0 = (code *)0x10c639;
    fVar2 = fdb_kvs_close(pfStack_dd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6eb;
    pcStack_de0 = (code *)0x10c64b;
    fVar2 = fdb_close(pfStack_dd0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_de0 = (code *)0x10c658;
      fdb_shutdown();
      pcStack_de0 = (code *)0x10c65d;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_de0 = (code *)0x10c68e;
      fprintf(_stderr,pcVar22,"snapshot after block reuse test");
      return;
    }
  }
  else {
LAB_0010c6bc:
    pcStack_de0 = (code *)0x10c6c3;
    snapshot_after_block_reuse_test();
LAB_0010c6c3:
    pcStack_de0 = (code *)0x10c6ca;
    snapshot_after_block_reuse_test();
LAB_0010c6ca:
    pcStack_de0 = (code *)0x10c6d1;
    snapshot_after_block_reuse_test();
LAB_0010c6d1:
    pcStack_de0 = (code *)0x10c6d8;
    snapshot_after_block_reuse_test();
LAB_0010c6d8:
    pcStack_de0 = (code *)0x10c6df;
    snapshot_after_block_reuse_test();
LAB_0010c6df:
    pcStack_de0 = (code *)0x10c6e6;
    snapshot_after_block_reuse_test();
LAB_0010c6e6:
    pcStack_de0 = (code *)0x10c6eb;
    snapshot_after_block_reuse_test();
LAB_0010c6eb:
    pcStack_de0 = (code *)0x10c6f2;
    snapshot_after_block_reuse_test();
  }
  pcStack_de0 = snapshot_inmem_before_block_reuse_test;
  snapshot_after_block_reuse_test();
  pcStack_f98 = (code *)0x10c70d;
  pfStack_e00 = (fdb_config *)pcVar14;
  pfStack_df8 = (fdb_kvs_handle *)handle._M_i;
  pfStack_df0 = (fdb_config *)pcVar22;
  psStack_de8 = (snap_handle *)pcVar26;
  pcStack_de0 = (code *)keylen;
  memleak_start();
  pcStack_f98 = (code *)0x10c719;
  gettimeofday(&tStack_f50,(__timezone_ptr_t)0x0);
  pfVar15 = (fdb_config *)(auStack_f40 + 0x48);
  pcStack_f98 = (code *)0x10c729;
  fdb_get_default_config();
  pcStack_f98 = (code *)0x10c733;
  fdb_get_default_kvs_config();
  pcStack_f98 = (code *)0x10c73f;
  system("rm -rf  staleblktest* > errorlog.txt");
  uStack_e28 = 1;
  pcStack_f98 = (code *)0x10c75e;
  fVar2 = fdb_open(&pfStack_f88,"./staleblktest1",pfVar15);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_f98 = (code *)0x10c778;
    fVar2 = fdb_kvs_open_default(pfStack_f88,&pfStack_f90,&fStack_f68);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca2a;
    pcStack_f98 = (code *)0x10c7a2;
    fVar2 = fdb_set_kv(pfStack_f90,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca31;
    pcStack_f98 = (code *)0x10c7b9;
    fVar2 = fdb_commit(pfStack_f88,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca38;
    pcStack_f98 = (code *)0x10c7d6;
    fVar2 = fdb_snapshot_open(pfStack_f90,&pfStack_f80,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca3f;
    keylen = 0;
    pcVar26 = auStack_f40;
    do {
      pcStack_f98 = (code *)0x10c80d;
      fVar2 = fdb_set_kv(pfStack_f90,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca0e;
      pcStack_f98 = (code *)0x10c822;
      fVar2 = fdb_get_file_info(pfStack_f88,(fdb_file_info *)pcVar26);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca07;
      uVar18 = (int)keylen + 1;
      keylen = (size_t)uVar18;
    } while ((ulong)auStack_f40._40_8_ < 0x1000001);
    pcVar26 = (char *)0x0;
    pfVar15 = (fdb_config *)0x148599;
    pcVar22 = "val";
    do {
      handle._M_i = (__int_type)uVar18;
      do {
        pcStack_f98 = (code *)0x10c865;
        fVar2 = fdb_set_kv(pfStack_f90,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_f98 = (code *)0x10ca07;
          snapshot_inmem_before_block_reuse_test();
          goto LAB_0010ca07;
        }
        uVar23 = (int)handle._M_i - 1;
        handle._M_i = (__int_type)uVar23;
      } while (uVar23 != 0);
      pcStack_f98 = (code *)0x10c881;
      fVar2 = fdb_commit(pfStack_f88,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca15;
      uVar23 = (int)pcVar26 + 1;
      pcVar26 = (char *)(ulong)uVar23;
    } while (uVar23 != 5);
    pcStack_f98 = (code *)0x10c89b;
    sVar3 = sb_check_block_reusing(pfStack_f90);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010ca46;
    pcStack_f98 = (code *)0x10c8c4;
    fVar2 = fdb_get_kv(pfStack_f80,"key",4,&pfStack_f78,&sStack_f70);
    pfVar16 = pfStack_f78;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca4b;
    pcStack_f98 = (code *)0x10c8e5;
    iVar4 = bcmp(pfStack_f78,"snp",sStack_f70);
    if (iVar4 != 0) goto LAB_0010ca52;
    pcStack_f98 = (code *)0x10c8f7;
    fVar2 = fdb_kvs_close(pfStack_f80);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca5a;
    pfVar16 = (fdb_config *)0x148599;
    pcVar22 = "val";
    do {
      pcStack_f98 = (code *)0x10c927;
      fVar2 = fdb_set_kv(pfStack_f90,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca1c;
      uVar18 = (int)keylen - 1;
      keylen = (size_t)uVar18;
    } while (uVar18 != 0);
    pcStack_f98 = (code *)0x10c942;
    fVar2 = fdb_commit(pfStack_f88,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca61;
    pcStack_f98 = (code *)0x10c95d;
    fVar2 = fdb_snapshot_open(pfStack_f90,&pfStack_f80,1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c977:
      if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010ca68;
      pcStack_f98 = (code *)0x10c98a;
      fVar2 = fdb_free_block(pfStack_f78);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca6d;
      pcStack_f98 = (code *)0x10c99b;
      fVar2 = fdb_kvs_close(pfStack_f90);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca74;
      pcStack_f98 = (code *)0x10c9ad;
      fVar2 = fdb_close(pfStack_f88);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_f98 = (code *)0x10c9ba;
        fdb_shutdown();
        pcStack_f98 = (code *)0x10c9bf;
        memleak_end();
        pcVar22 = "%s PASSED\n";
        if (snapshot_inmem_before_block_reuse_test()::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        pcStack_f98 = (code *)0x10c9f0;
        fprintf(_stderr,pcVar22,"snapshot inmem before block reuse test");
        return;
      }
      goto LAB_0010ca7b;
    }
    pcStack_f98 = (code *)0x10c96b;
    fVar5 = fdb_kvs_close(pfStack_f80);
    fVar2 = FDB_RESULT_SUCCESS;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010c977;
  }
  else {
LAB_0010ca23:
    pcStack_f98 = (code *)0x10ca2a;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca2a:
    pcStack_f98 = (code *)0x10ca31;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca31:
    pcStack_f98 = (code *)0x10ca38;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca38:
    pcStack_f98 = (code *)0x10ca3f;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca3f:
    pcStack_f98 = (code *)0x10ca46;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca46:
    pcStack_f98 = (code *)0x10ca4b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca4b:
    pfVar16 = pfVar15;
    pcStack_f98 = (code *)0x10ca52;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca52:
    pcStack_f98 = (code *)0x10ca5a;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca5a:
    pcStack_f98 = (code *)0x10ca61;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca61:
    pcStack_f98 = (code *)0x10ca68;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca68:
    pcStack_f98 = (code *)0x10ca6d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca6d:
    pcStack_f98 = (code *)0x10ca74;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca74:
    pcStack_f98 = (code *)0x10ca7b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca7b:
    pcStack_f98 = (code *)0x10ca82;
    snapshot_inmem_before_block_reuse_test();
  }
  pcStack_f98 = variable_value_size_test;
  snapshot_inmem_before_block_reuse_test();
  aVar24.seqtree = (btree *)0x0;
  pcStack_1280 = (code *)0x10caa7;
  pfStack_fc0 = pfVar16;
  pfStack_fb8 = (fdb_kvs_handle *)handle._M_i;
  pfStack_fb0 = pfVar7;
  pfStack_fa8 = (fdb_config *)pcVar22;
  psStack_fa0 = (snap_handle *)pcVar26;
  pcStack_f98 = (code *)keylen;
  gettimeofday(&tStack_1228,(__timezone_ptr_t)0x0);
  pcStack_1280 = (code *)0x10caac;
  memleak_start();
  pcStack_1280 = (code *)0x10cab6;
  pcVar26 = (char *)operator_new__(0x500000);
  pcVar22 = auStack_1218;
  pcStack_1280 = (code *)0x10cac6;
  fdb_get_default_kvs_config();
  pfVar15 = &fStack_10b8;
  pcStack_1280 = (code *)0x10cad6;
  fdb_get_default_config();
  fStack_10b8.compaction_threshold = '\0';
  fStack_10b8.block_reusing_threshold = 0x41;
  pcStack_1280 = (code *)0x10caf4;
  system("rm -rf  staleblktest* > errorlog.txt");
  handle_00.seqtree = (btree *)&pfStack_1270;
  pcStack_1280 = (code *)0x10cb0b;
  fdb_open((fdb_file_handle **)handle_00.seqtree,"./staleblktest1",pfVar15);
  pcStack_1280 = (code *)0x10cb1a;
  fdb_kvs_open_default
            (pfStack_1270,(fdb_kvs_handle **)&aStack_1278.seqtree,(fdb_kvs_config *)pcVar22);
  if (fStack_10b8.num_keeping_headers != 0xffffffffffffffff) {
    pcVar14 = "%d_key";
    pcVar22 = (char *)&fStack_11b8;
    aVar24.seqtree = (btree *)0x0;
    iVar4 = 0;
    do {
      sStack_1268 = CONCAT44(sStack_1268._4_4_,iVar4 + 3);
      pfVar15 = (fdb_config *)0x1ff;
      aStack_1260 = aVar24;
      do {
        pcStack_1280 = (code *)0x10cb60;
        sprintf(pcVar22,"%d_key",(ulong)((int)pfVar15 + 1));
        pcStack_1280 = (code *)0x10cb70;
        memset(pcVar26,0x61,(size_t)pfVar15);
        handle_00 = aStack_1278;
        pcVar26[(long)pfVar15] = '\0';
        pcStack_1280 = (code *)0x10cb81;
        sVar6 = strlen(pcVar22);
        keylen = sVar6 + 1;
        pcStack_1280 = (code *)0x10cb8d;
        sVar6 = strlen(pcVar26);
        pcStack_1280 = (code *)0x10cba2;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar22,keylen,pcVar26,sVar6 + 1);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d083;
        pfVar15 = (fdb_config *)&pfVar15[2].wal_threshold;
      } while (pfVar15 != (fdb_config *)0x7ff);
      pcStack_1280 = (code *)0x10cbc9;
      fVar2 = fdb_commit(pfStack_1270,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d091;
      aVar24.seqtree = (btree *)&(aStack_1260.seqtree)->vsize;
      iVar4 = (int)sStack_1268;
    } while (aVar24.seqtree < (undefined1 *)(fStack_10b8.num_keeping_headers + 1));
    aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(long)(int)sStack_1268;
  }
  pcStack_1280 = (code *)0x10cc05;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_1278.seqtree,
                            (fdb_kvs_handle **)&aStack_1240.seqtree,(fdb_seqnum_t)aVar24);
  sVar21 = keylen;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    sVar8 = 0xffffffff;
    pcVar22 = "%d_key";
    pfVar15 = &fStack_11b8;
    handle_00.seqtree = (btree *)0x0;
LAB_0010cc24:
    keylen = 0x3ff;
    sStack_1268 = sVar8;
    aStack_1260 = handle_00;
LAB_0010cc33:
    pcStack_1280 = (code *)0x10cc43;
    sprintf((char *)pfVar15,"%d_key",(ulong)((int)keylen + 1));
    pcStack_1280 = (code *)0x10cc53;
    memset(pcVar26,0x62,keylen);
    handle_00 = aStack_1278;
    pcVar26[keylen] = '\0';
    pcStack_1280 = (code *)0x10cc63;
    sVar6 = strlen((char *)pfVar15);
    pcVar14 = (char *)(sVar6 + 1);
    pcStack_1280 = (code *)0x10cc6f;
    sVar6 = strlen(pcVar26);
    pcStack_1280 = (code *)0x10cc84;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pfVar15,(size_t)pcVar14,pcVar26,sVar6 + 1
                      );
    if (fVar2 == FDB_RESULT_SUCCESS) goto code_r0x0010cc8c;
    pcStack_1280 = (code *)0x10d083;
    variable_value_size_test();
LAB_0010d083:
    pcStack_1280 = (code *)0x10d08a;
    variable_value_size_test();
    goto LAB_0010d08a;
  }
LAB_0010d0a6:
  pcStack_1280 = (code *)0x10d0ad;
  variable_value_size_test();
LAB_0010d0ad:
  pcStack_1280 = (code *)0x10d0b2;
  variable_value_size_test();
LAB_0010d0b2:
  pcStack_1280 = (code *)0x10d0b9;
  variable_value_size_test();
LAB_0010d0b9:
  pcStack_1280 = (code *)0x10d0c0;
  variable_value_size_test();
LAB_0010d0c0:
  pcStack_1280 = (code *)0x10d0c7;
  variable_value_size_test();
LAB_0010d0c7:
  pcStack_1280 = (code *)0x10d0ce;
  variable_value_size_test();
LAB_0010d0ce:
  pcStack_1280 = (code *)0x10d0d5;
  variable_value_size_test();
LAB_0010d0d5:
  aVar25 = aVar24;
  pcStack_1280 = (code *)0x10d0dc;
  variable_value_size_test();
LAB_0010d0dc:
  pcStack_1280 = (code *)0x10d0e4;
  variable_value_size_test();
LAB_0010d0e4:
  pcStack_1280 = (code *)0x10d0eb;
  variable_value_size_test();
LAB_0010d0eb:
  pcStack_1280 = (code *)0x10d0f2;
  variable_value_size_test();
LAB_0010d0f2:
  pcStack_1280 = (code *)0x10d0fa;
  variable_value_size_test();
LAB_0010d0fa:
  pcStack_1280 = (code *)0x10d101;
  variable_value_size_test();
LAB_0010d101:
  pcStack_1280 = (code *)0x10d108;
  variable_value_size_test();
LAB_0010d108:
  pcStack_1280 = (code *)0x10d10f;
  variable_value_size_test();
LAB_0010d10f:
  pcStack_1280 = (code *)0x10d116;
  variable_value_size_test();
LAB_0010d116:
  pcStack_1280 = rollback_with_num_keeping_headers;
  variable_value_size_test();
  pcStack_1958 = (code *)0x10d13a;
  pcStack_12a8 = pcVar26;
  pfStack_12a0 = pfVar15;
  aStack_1298 = handle_00;
  aStack_1290 = aVar25;
  aStack_1288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar22;
  pcStack_1280 = (code *)sVar21;
  gettimeofday(&tStack_1910,(__timezone_ptr_t)0x0);
  pcStack_1958 = (code *)0x10d13f;
  memleak_start();
  pcStack_1958 = (code *)0x10d14c;
  fdb_get_default_kvs_config();
  pcStack_1958 = (code *)0x10d15c;
  fdb_get_default_config();
  fStack_13a0.compaction_threshold = '\0';
  fStack_13a0.block_reusing_threshold = 0x41;
  fStack_13a0.num_keeping_headers = 1;
  pcStack_1958 = (code *)0x10d183;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_1958 = (code *)0x10d19a;
  fdb_open(&pfStack_1948,"./staleblktest1",&fStack_13a0);
  pcStack_1958 = (code *)0x10d1a8;
  fdb_kvs_open_default(pfStack_1948,&pfStack_1950,&fStack_1900);
  pcVar17 = "%dkey";
  pcVar26 = acStack_18a0;
  pcVar14 = acStack_17a0;
  pcVar22 = (char *)0x0;
  do {
    pcStack_1958 = (code *)0x10d1d0;
    sprintf(pcVar26,"%dkey",pcVar22);
    pcStack_1958 = (code *)0x10d1e2;
    memset(pcVar14,0x62,0x1ff);
    pfVar7 = pfStack_1950;
    uStack_15a1 = 0;
    pcStack_1958 = (code *)0x10d1f6;
    sVar9 = strlen(pcVar26);
    pcStack_1958 = (code *)0x10d201;
    sVar6 = strlen(pcVar14);
    pcStack_1958 = (code *)0x10d215;
    fVar2 = fdb_set_kv(pfVar7,pcVar26,sVar9,pcVar14,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d465:
      pcStack_1958 = (code *)0x10d46c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d46c;
    }
    pcStack_1958 = (code *)0x10d22c;
    fVar2 = fdb_commit(pfStack_1948,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1958 = (code *)0x10d465;
      rollback_with_num_keeping_headers();
      goto LAB_0010d465;
    }
    uVar18 = (int)pcVar22 + 1;
    pcVar22 = (char *)(ulong)uVar18;
  } while (uVar18 != 10);
  pcVar14 = (char *)0x0;
  pcVar22 = acStack_18a0;
  pcVar26 = acStack_17a0;
  pcVar17 = (char *)0x0;
  do {
    pfVar7 = pfStack_1950;
    builtin_strncpy(acStack_18a0,"0key",5);
    builtin_strncpy(acStack_17a0,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_1958 = (code *)0x10d2be;
    sVar9 = strlen(pcVar22);
    pcStack_1958 = (code *)0x10d2c9;
    sVar6 = strlen(pcVar26);
    pcStack_1958 = (code *)0x10d2dd;
    fVar2 = fdb_set_kv(pfVar7,pcVar22,sVar9,pcVar26,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d473;
    pcStack_1958 = (code *)0x10d2f4;
    fVar2 = fdb_get_file_info(pfStack_1948,&fStack_18e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d46c;
    uVar18 = (int)pcVar17 + 1;
    pcVar17 = (char *)(ulong)uVar18;
  } while (fStack_18e8.file_size < 0x1000000);
  pcStack_1958 = (code *)0x10d319;
  sVar3 = sb_check_block_reusing(pfStack_1950);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_1958 = (code *)0x10d331;
    fVar2 = fdb_commit(pfStack_1948,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d486;
    pcVar26 = acStack_18a0;
    pcVar14 = acStack_17a0;
    pcVar22 = (char *)0x0;
    do {
      pcStack_1958 = (code *)0x10d35e;
      sprintf(pcVar26,"%dkey",pcVar22);
      pcStack_1958 = (code *)0x10d370;
      memset(pcVar14,100,0x1ff);
      pfVar7 = pfStack_1950;
      uStack_15a1 = 0;
      pcStack_1958 = (code *)0x10d384;
      sVar9 = strlen(pcVar26);
      pcStack_1958 = (code *)0x10d38f;
      sVar6 = strlen(pcVar14);
      pcStack_1958 = (code *)0x10d3a3;
      fVar2 = fdb_set_kv(pfVar7,pcVar26,sVar9,pcVar14,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d47a;
      uVar23 = (int)pcVar22 + 1;
      pcVar22 = (char *)(ulong)uVar23;
    } while (uVar18 != uVar23);
    pcStack_1958 = (code *)0x10d3be;
    fVar2 = fdb_rollback(&pfStack_1950,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d48d;
    pcStack_1958 = (code *)0x10d3d4;
    fVar2 = fdb_get_kvs_info(pfStack_1950,&fStack_1940);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d494;
    if (fStack_1940.doc_count != 10) {
      pcStack_1958 = (code *)0x10d3ee;
      rollback_with_num_keeping_headers();
    }
    pcStack_1958 = (code *)0x10d3f7;
    fVar2 = fdb_kvs_close(pfStack_1950);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d49b;
    pcStack_1958 = (code *)0x10d409;
    fVar2 = fdb_close(pfStack_1948);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1958 = (code *)0x10d416;
      fdb_shutdown();
      pcStack_1958 = (code *)0x10d41b;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_1958 = (code *)0x10d44c;
      fprintf(_stderr,pcVar22,"rollback with num keeping headers");
      return;
    }
  }
  else {
LAB_0010d481:
    pcStack_1958 = (code *)0x10d486;
    rollback_with_num_keeping_headers();
LAB_0010d486:
    pcStack_1958 = (code *)0x10d48d;
    rollback_with_num_keeping_headers();
LAB_0010d48d:
    pcStack_1958 = (code *)0x10d494;
    rollback_with_num_keeping_headers();
LAB_0010d494:
    pcStack_1958 = (code *)0x10d49b;
    rollback_with_num_keeping_headers();
LAB_0010d49b:
    pcStack_1958 = (code *)0x10d4a2;
    rollback_with_num_keeping_headers();
  }
  pcStack_1958 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_1e40 = (code *)0x10d4c6;
  fStack_1b78.bub_ctx.space_used = (uint64_t)pcVar17;
  sStack_1970 = sVar9;
  pcStack_1968 = pcVar26;
  pcStack_1960 = pcVar14;
  pcStack_1958 = (code *)pcVar22;
  gettimeofday(&tStack_1e00,(__timezone_ptr_t)0x0);
  pcStack_1e40 = (code *)0x10d4cb;
  memleak_start();
  pcStack_1e40 = (code *)0x10d4d8;
  fdb_get_default_kvs_config();
  pcStack_1e40 = (code *)0x10d4e8;
  fdb_get_default_config();
  fStack_1b78.config.block_reusing_threshold._7_1_ = 0;
  fStack_1b78.max_seqnum = 0x41;
  fStack_1b78.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1b78.dirty_updates = '\0';
  fStack_1b78._466_6_ = 0;
  pcStack_1e40 = (code *)0x10d50f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_1e40 = (code *)0x10d526;
  fdb_open(&pfStack_1e30,"./staleblktest1file.1",(fdb_config *)&fStack_1b78.config.encryption_key);
  pcStack_1e40 = (code *)0x10d53b;
  fdb_kvs_open(pfStack_1e30,&pfStack_1e38,"./staleblktest1",&fStack_1e18);
  pcVar26 = "%dkey";
  pfVar7 = &fStack_1b78;
  pfVar12 = (fdb_kvs_handle *)auStack_1d78;
  pcVar22 = (char *)0x0;
  do {
    pcStack_1e40 = (code *)0x10d563;
    sprintf((char *)pfVar7,"%dkey",pcVar22);
    pcStack_1e40 = (code *)0x10d575;
    memset(pfVar12,0x62,0x1ff);
    pfVar11 = pfStack_1e38;
    auStack_1d78[0x1ff] = 0;
    pcStack_1e40 = (code *)0x10d589;
    pfVar10 = (fdb_kvs_handle *)strlen((char *)pfVar7);
    pcStack_1e40 = (code *)0x10d594;
    sVar6 = strlen((char *)pfVar12);
    pcStack_1e40 = (code *)0x10d5a8;
    fVar2 = fdb_set_kv(pfVar11,pfVar7,(size_t)pfVar10,pfVar12,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010da08:
      pcStack_1e40 = (code *)0x10da0f;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da0f;
    }
    pcStack_1e40 = (code *)0x10d5bf;
    fVar2 = fdb_commit(pfStack_1e30,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1e40 = (code *)0x10da08;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da08;
    }
    uVar18 = (int)pcVar22 + 1;
    pcVar22 = (char *)(ulong)uVar18;
  } while (uVar18 != 0xb);
  pfVar12 = (fdb_kvs_handle *)0x0;
  pcVar26 = (char *)&fStack_1b78;
  pcVar22 = auStack_1d78;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pfVar11 = pfStack_1e38;
    fStack_1b78.kvs_config._4_1_ = 0;
    fStack_1b78.kvs_config.create_if_missing = true;
    fStack_1b78.kvs_config._1_3_ = 0x79656b;
    auStack_1d78._0_8_ = 0x6363636363636363;
    auStack_1d78._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1d78._16_8_ = (void *)0x6363636363636363;
    auStack_1d78._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1d78._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1d78._40_7_ = 0x63636363636363;
    auStack_1d78[0x2f] = 99;
    auStack_1d78._48_7_ = 0x63636363636363;
    auStack_1d78[0x37] = 99;
    auStack_1d78._56_7_ = 0x63636363636363;
    auStack_1d78[0x3f] = 99;
    auStack_1d78._64_8_ = (btree *)0x6363636363636363;
    auStack_1d78._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1d78._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1d78._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1d78._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1d78._104_7_ = 0x63636363636363;
    auStack_1d78[0x6f] = 99;
    auStack_1d78._112_7_ = 0x63636363636363;
    auStack_1d78._119_8_ = 0x6363636363636363;
    auStack_1d78[0x7f] = 0;
    pcStack_1e40 = (code *)0x10d652;
    pfVar10 = (fdb_kvs_handle *)strlen(pcVar26);
    pcStack_1e40 = (code *)0x10d65d;
    sVar6 = strlen(pcVar22);
    pcStack_1e40 = (code *)0x10d671;
    fVar2 = fdb_set_kv(pfVar11,pcVar26,(size_t)pfVar10,pcVar22,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da16;
    pcStack_1e40 = (code *)0x10d688;
    fVar2 = fdb_get_file_info(pfStack_1e30,&fStack_1df0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da0f;
    pfVar7 = (fdb_kvs_handle *)(ulong)((int)pfVar7 + 1);
  } while (fStack_1df0.file_size < 0x1000000);
  pcStack_1e40 = (code *)0x10d6ab;
  sVar3 = sb_check_block_reusing(pfStack_1e38);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_1e40 = (code *)0x10d6c3;
    fVar2 = fdb_commit(pfStack_1e30,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da45;
    pcStack_1e40 = (code *)0x10d6dc;
    fVar2 = fdb_get_kvs_info(pfStack_1e38,&fStack_1da8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da4c;
    pfStack_1e28 = (fdb_kvs_handle *)fStack_1da8.last_seqnum;
    pfVar12 = &fStack_1b78;
    pfVar11 = (fdb_kvs_handle *)auStack_1d78;
    pcVar22 = (char *)0x0;
    do {
      pcStack_1e40 = (code *)0x10d716;
      sprintf((char *)pfVar12,"%dkey",pcVar22);
      pfVar10 = pfStack_1e38;
      auStack_1d78._0_8_ = 0x6464646464646464;
      auStack_1d78._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_1d78._16_8_ = (void *)0x6464646464646464;
      auStack_1d78._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_1d78._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_1d78._40_7_ = 0x64646464646464;
      auStack_1d78[0x2f] = 100;
      auStack_1d78._48_7_ = 0x64646464646464;
      auStack_1d78[0x37] = 100;
      auStack_1d78._56_7_ = 0x64646464646464;
      auStack_1d78[0x3f] = 0;
      pcStack_1e40 = (code *)0x10d751;
      pcVar26 = (char *)strlen((char *)pfVar12);
      pcStack_1e40 = (code *)0x10d75c;
      sVar6 = strlen((char *)pfVar11);
      pcStack_1e40 = (code *)0x10d770;
      fVar2 = fdb_set_kv(pfVar10,pfVar12,(size_t)pcVar26,pfVar11,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da24;
      pcStack_1e40 = (code *)0x10d787;
      fVar2 = fdb_commit(pfStack_1e30,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da1d;
      uVar18 = (int)pcVar22 + 1;
      pcVar22 = (char *)(ulong)uVar18;
    } while (uVar18 != 10);
    pcStack_1e40 = (code *)0x10d7a3;
    fVar2 = fdb_kvs_close(pfStack_1e38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da53;
    pcStack_1e40 = (code *)0x10d7b5;
    fVar2 = fdb_close(pfStack_1e30);
    pcVar26 = (char *)pfStack_1e28;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da5a;
    pcStack_1e40 = (code *)0x10d7c7;
    fdb_shutdown();
    pcStack_1e40 = (code *)0x10d7e0;
    fVar2 = fdb_open(&pfStack_1e30,"./staleblktest1file.1",
                     (fdb_config *)&fStack_1b78.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da61;
    pcStack_1e40 = (code *)0x10d801;
    fdb_kvs_open(pfStack_1e30,&pfStack_1e38,"./staleblktest1",&fStack_1e18);
    pcStack_1e40 = (code *)0x10d810;
    fVar2 = fdb_get_file_info(pfStack_1e30,&fStack_1df0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da68;
    pcStack_1e40 = (code *)0x10d838;
    iVar4 = _disk_dump("./staleblktest1file.1",fStack_1df0.file_size,
                       (ulong)(((uint)fStack_1b78.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_1b78.config.encryption_key.bytes._0_4_ * 2));
    if (iVar4 < 0) goto LAB_0010da6f;
    pcStack_1e40 = (code *)0x10d851;
    fVar2 = fdb_snapshot_open(pfStack_1e38,&pfStack_1e20,(fdb_seqnum_t)pcVar26);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da74;
    pcStack_1e40 = (code *)0x10d864;
    fVar2 = fdb_rollback(&pfStack_1e38,(fdb_seqnum_t)pcVar26);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da7b;
    pcStack_1e40 = (code *)0x10d87d;
    fVar2 = fdb_compact(pfStack_1e30,"./staleblktest1file.3");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da82;
    pcVar26 = "%dkey";
    pfVar11 = &fStack_1b78;
    pcVar22 = (char *)0x0;
    do {
      pcStack_1e40 = (code *)0x10d8a5;
      sprintf((char *)pfVar11,"%dkey",pcVar22);
      pfVar12 = pfStack_1e38;
      pcStack_1e40 = (code *)0x10d8b1;
      sVar6 = strlen((char *)pfVar11);
      pcStack_1e40 = (code *)0x10d8bf;
      fVar2 = fdb_del_kv(pfVar12,pfVar11,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da32;
      pcStack_1e40 = (code *)0x10d8d6;
      fVar2 = fdb_commit(pfStack_1e30,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da2b;
      uVar18 = (int)pcVar22 + 1;
      pcVar22 = (char *)(ulong)uVar18;
    } while (uVar18 != 0xb);
    pcStack_1e40 = (code *)0x10d8ee;
    sVar3 = sb_check_block_reusing(pfStack_1e38);
    if (sVar3 != SBD_NONE) goto LAB_0010da89;
    pcVar22 = (char *)0x0;
    pcVar26 = auStack_1d78;
    pfVar10 = &fStack_1b78;
    do {
      fStack_1b78.kvs_config._4_1_ = 0;
      fStack_1b78.kvs_config.create_if_missing = true;
      fStack_1b78.kvs_config._1_3_ = 0x79656b;
      pcStack_1e40 = (code *)0x10d92d;
      memset(pcVar26,0x65,0x1ff);
      pfVar12 = pfStack_1e38;
      auStack_1d78[0x1ff] = 0;
      pcStack_1e40 = (code *)0x10d941;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar10);
      pcStack_1e40 = (code *)0x10d94c;
      sVar6 = strlen(pcVar26);
      pcStack_1e40 = (code *)0x10d960;
      fVar2 = fdb_set_kv(pfVar12,pfVar10,(size_t)pfVar11,pcVar26,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da39;
      uVar18 = (int)pfVar7 - 1;
      pfVar7 = (fdb_kvs_handle *)(ulong)uVar18;
    } while (uVar18 != 0);
    pcStack_1e40 = (code *)0x10d976;
    sVar3 = sb_check_block_reusing(pfStack_1e38);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010da8e;
    pcStack_1e40 = (code *)0x10d989;
    fVar2 = fdb_kvs_close(pfStack_1e20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da93;
    pcStack_1e40 = (code *)0x10d99a;
    fVar2 = fdb_kvs_close(pfStack_1e38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da9a;
    pcStack_1e40 = (code *)0x10d9ac;
    fVar2 = fdb_close(pfStack_1e30);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1e40 = (code *)0x10d9b9;
      fdb_shutdown();
      pcStack_1e40 = (code *)0x10d9be;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_1e40 = (code *)0x10d9ef;
      fprintf(_stderr,pcVar22,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da40:
    pcStack_1e40 = (code *)0x10da45;
    crash_and_recover_with_num_keeping_test();
LAB_0010da45:
    pcStack_1e40 = (code *)0x10da4c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4c:
    pcStack_1e40 = (code *)0x10da53;
    crash_and_recover_with_num_keeping_test();
LAB_0010da53:
    pcStack_1e40 = (code *)0x10da5a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5a:
    pcStack_1e40 = (code *)0x10da61;
    crash_and_recover_with_num_keeping_test();
LAB_0010da61:
    pcStack_1e40 = (code *)0x10da68;
    crash_and_recover_with_num_keeping_test();
LAB_0010da68:
    pcStack_1e40 = (code *)0x10da6f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6f:
    pcStack_1e40 = (code *)0x10da74;
    crash_and_recover_with_num_keeping_test();
LAB_0010da74:
    pcStack_1e40 = (code *)0x10da7b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7b:
    pcStack_1e40 = (code *)0x10da82;
    crash_and_recover_with_num_keeping_test();
LAB_0010da82:
    pcStack_1e40 = (code *)0x10da89;
    crash_and_recover_with_num_keeping_test();
LAB_0010da89:
    pcStack_1e40 = (code *)0x10da8e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da8e:
    pcStack_1e40 = (code *)0x10da93;
    crash_and_recover_with_num_keeping_test();
LAB_0010da93:
    pcStack_1e40 = (code *)0x10da9a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da9a:
    pcStack_1e40 = (code *)0x10daa1;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_1e40 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_22e8 = (fdb_kvs_handle *)0x10dac5;
  pfStack_1e68 = (fdb_kvs_handle *)pcVar26;
  pfStack_1e60 = pfVar11;
  pfStack_1e58 = pfVar10;
  pfStack_1e50 = pfVar7;
  pfStack_1e48 = pfVar12;
  pcStack_1e40 = (code *)pcVar22;
  gettimeofday(&tStack_22d0,(__timezone_ptr_t)0x0);
  pfStack_22e8 = (fdb_kvs_handle *)0x10daca;
  memleak_start();
  pfStack_22e8 = (fdb_kvs_handle *)0x10dada;
  fdb_get_default_kvs_config();
  pfStack_22e8 = (fdb_kvs_handle *)0x10daea;
  fdb_get_default_config();
  uStack_1f31 = 0;
  pfStack_1ea8 = (fdb_kvs_handle *)0x41;
  uStack_1e90 = 10;
  pfStack_22e8 = (fdb_kvs_handle *)0x10db11;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_22e8 = (fdb_kvs_handle *)0x10db28;
  fdb_open(&pfStack_22d8,"./staleblktest1",(fdb_config *)(auStack_20a8 + 0x148));
  pfStack_22e8 = (fdb_kvs_handle *)0x10db36;
  fdb_kvs_open_default(pfStack_22d8,&pfStack_22e0,(fdb_kvs_config *)(auStack_22c0 + 0x200));
  pcVar14 = "%dkey";
  pcVar26 = auStack_20a8 + 0x48;
  pcVar22 = auStack_22c0;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_22e8 = (fdb_kvs_handle *)0x10db5b;
    sprintf(pcVar26,"%dkey",pfVar7);
    pfStack_22e8 = (fdb_kvs_handle *)0x10db6d;
    memset(pcVar22,0x62,0x1ff);
    pfVar12 = pfStack_22e0;
    auStack_22c0[0x1ff] = 0;
    pfStack_22e8 = (fdb_kvs_handle *)0x10db81;
    pfVar11 = (fdb_kvs_handle *)strlen(pcVar26);
    pfStack_22e8 = (fdb_kvs_handle *)0x10db8c;
    sVar6 = strlen(pcVar22);
    pfStack_22e8 = (fdb_kvs_handle *)0x10dba0;
    fVar2 = fdb_set_kv(pfVar12,pcVar26,(size_t)pfVar11,pcVar22,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010de39:
      pfStack_22e8 = (fdb_kvs_handle *)0x10de40;
      reuse_on_delete_test();
      goto LAB_0010de40;
    }
    pfStack_22e8 = (fdb_kvs_handle *)0x10dbb7;
    fVar2 = fdb_commit(pfStack_22d8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_22e8 = (fdb_kvs_handle *)0x10de39;
      reuse_on_delete_test();
      goto LAB_0010de39;
    }
    uVar18 = (int)pfVar7 + 1;
    pfVar7 = (fdb_kvs_handle *)(ulong)uVar18;
  } while (uVar18 != 0xb);
  pcVar22 = auStack_20a8 + 0x48;
  pfVar12 = (fdb_kvs_handle *)auStack_22c0;
  pfVar11 = (fdb_kvs_handle *)auStack_20a8;
  pcVar14 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar10 = (fdb_kvs_handle *)pcVar14;
    pfStack_22e8 = (fdb_kvs_handle *)0x10dbf0;
    sprintf(pcVar22,"%dkey",pfVar10);
    pfVar7 = pfStack_22e0;
    auStack_22c0._0_8_ = 0x6363636363636363;
    auStack_22c0._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_22c0._16_8_ = (void *)0x6363636363636363;
    auStack_22c0._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_22c0._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_22c0._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_22c0._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_22c0._56_8_ = (btree *)0x6363636363636363;
    auStack_22c0._64_8_ = (btree *)0x6363636363636363;
    auStack_22c0._72_8_ = (filemgr *)0x6363636363636363;
    auStack_22c0._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_22c0._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_22c0._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_22c0._104_7_ = 0x63636363636363;
    auStack_22c0[0x6f] = 99;
    auStack_22c0._112_7_ = 0x63636363636363;
    auStack_22c0._119_8_ = 0x6363636363636363;
    auStack_22c0[0x7f] = 0;
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc39;
    pcVar26 = (char *)strlen(pcVar22);
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc44;
    sVar6 = strlen((char *)pfVar12);
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc58;
    fVar2 = fdb_set_kv(pfVar7,pcVar22,(size_t)pcVar26,pfVar12,sVar6);
    pcVar14 = (char *)pfVar10;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de47;
    pfStack_22e8 = (fdb_kvs_handle *)0x10dc6d;
    fVar2 = fdb_get_file_info(pfStack_22d8,(fdb_file_info *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de40;
    uVar18 = (uint)pfVar10 + 1;
    pcVar14 = (char *)(ulong)uVar18;
  } while ((ulong)auStack_20a8._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_22e8 = (fdb_kvs_handle *)0x10dc92;
  sVar3 = sb_check_block_reusing(pfStack_22e0);
  if (sVar3 == SBD_NONE) {
    pfStack_22e8 = (fdb_kvs_handle *)0x10dca9;
    fVar2 = fdb_commit(pfStack_22d8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de61;
    pcVar26 = "%dkey";
    pcVar22 = auStack_20a8 + 0x48;
    pfVar7 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_22e8 = (fdb_kvs_handle *)0x10dcd5;
      sprintf(pcVar22,"%dkey",pfVar7);
      pfVar12 = pfStack_22e0;
      pfStack_22e8 = (fdb_kvs_handle *)0x10dce1;
      sVar6 = strlen(pcVar22);
      pfStack_22e8 = (fdb_kvs_handle *)0x10dcef;
      fVar2 = fdb_del_kv(pfVar12,pcVar22,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de4e;
      uVar23 = (int)pfVar7 + 1;
      pfVar7 = (fdb_kvs_handle *)(ulong)uVar23;
    } while (uVar18 != uVar23);
    pfStack_22e8 = (fdb_kvs_handle *)0x10dd06;
    sVar3 = sb_check_block_reusing(pfStack_22e0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de68;
    if (2 < (uint)pfVar10) {
      pcVar14 = (char *)(ulong)(uVar18 >> 2);
      pcVar22 = auStack_20a8 + 0x48;
      pfVar12 = (fdb_kvs_handle *)auStack_22c0;
      pfVar7 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_22e8 = (fdb_kvs_handle *)0x10dd3e;
        sprintf(pcVar22,"%dkey",pfVar7);
        pfVar10 = pfStack_22e0;
        auStack_22c0._0_8_ = 0x6464646464646464;
        auStack_22c0._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_22c0._16_8_ = (void *)0x6464646464646464;
        auStack_22c0._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_22c0._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_22c0._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_22c0._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_22c0._56_8_ = (btree *)0x6464646464646464;
        auStack_22c0._64_8_ = (btree *)0x6464646464646464;
        auStack_22c0._72_8_ = (filemgr *)0x6464646464646464;
        auStack_22c0._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_22c0._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_22c0._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_22c0._104_7_ = 0x64646464646464;
        auStack_22c0[0x6f] = 100;
        auStack_22c0._112_7_ = 0x64646464646464;
        auStack_22c0._119_8_ = 0x6464646464646464;
        auStack_22c0[0x7f] = 0;
        pfStack_22e8 = (fdb_kvs_handle *)0x10dd87;
        pcVar26 = (char *)strlen(pcVar22);
        pfStack_22e8 = (fdb_kvs_handle *)0x10dd92;
        sVar6 = strlen((char *)pfVar12);
        pfStack_22e8 = (fdb_kvs_handle *)0x10dda6;
        fVar2 = fdb_set_kv(pfVar10,pcVar22,(size_t)pcVar26,pfVar12,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de55;
        uVar23 = (int)pfVar7 + 2;
        pfVar7 = (fdb_kvs_handle *)(ulong)uVar23;
      } while (uVar23 < uVar18 >> 2);
    }
    pcVar22 = auStack_20a8 + 0x48;
    pfStack_22e8 = (fdb_kvs_handle *)0x10ddc2;
    sVar3 = sb_check_block_reusing(pfStack_22e0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de6d;
    pfStack_22e8 = (fdb_kvs_handle *)0x10ddd5;
    fVar2 = fdb_close(pfStack_22d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de72;
    pfStack_22e8 = (fdb_kvs_handle *)0x10dde2;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_22e8 = (fdb_kvs_handle *)0x10ddef;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_22e8 = (fdb_kvs_handle *)0x10de20;
      fprintf(_stderr,pcVar22,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de5c:
    pfStack_22e8 = (fdb_kvs_handle *)0x10de61;
    reuse_on_delete_test();
LAB_0010de61:
    pfVar10 = pfVar11;
    pfStack_22e8 = (fdb_kvs_handle *)0x10de68;
    reuse_on_delete_test();
LAB_0010de68:
    pfStack_22e8 = (fdb_kvs_handle *)0x10de6d;
    reuse_on_delete_test();
LAB_0010de6d:
    pfStack_22e8 = (fdb_kvs_handle *)0x10de72;
    reuse_on_delete_test();
LAB_0010de72:
    pfStack_22e8 = (fdb_kvs_handle *)0x10de79;
    reuse_on_delete_test();
  }
  pfStack_22e8 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_27d0 = (fdb_kvs_handle *)0x10de9d;
  fStack_2508.bub_ctx.space_used = (uint64_t)pcVar14;
  fStack_2508.bub_ctx.handle = pfVar12;
  pfStack_2300 = pfVar10;
  pcStack_22f8 = pcVar26;
  pcStack_22f0 = pcVar22;
  pfStack_22e8 = pfVar7;
  gettimeofday(&tStack_2778,(__timezone_ptr_t)0x0);
  pfStack_27d0 = (fdb_kvs_handle *)0x10dea2;
  memleak_start();
  pfStack_27d0 = (fdb_kvs_handle *)0x10deaf;
  fdb_get_default_kvs_config();
  pfStack_27d0 = (fdb_kvs_handle *)0x10debf;
  fdb_get_default_config();
  fStack_2508.config.block_reusing_threshold._7_1_ = 0;
  fStack_2508.max_seqnum = 0x23;
  fStack_2508.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_2508.dirty_updates = '\0';
  fStack_2508._466_6_ = 0;
  pfStack_27d0 = (fdb_kvs_handle *)0x10dee6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_27d0 = (fdb_kvs_handle *)0x10defd;
  fdb_open(&pfStack_27b8,"./staleblktest1",(fdb_config *)&fStack_2508.config.encryption_key);
  pfStack_27d0 = (fdb_kvs_handle *)0x10df0d;
  fdb_kvs_open_default(pfStack_27b8,&pfStack_27c0,&fStack_2768);
  pcVar14 = "%dkey";
  pcVar22 = (char *)&fStack_2508;
  pcVar26 = auStack_2750 + 0x48;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_27d0 = (fdb_kvs_handle *)0x10df35;
    sprintf(pcVar22,"%dkey",pfVar7);
    pfStack_27d0 = (fdb_kvs_handle *)0x10df47;
    memset(pcVar26,0x61,0x1ff);
    pfVar11 = pfStack_27c0;
    uStack_2509 = 0;
    pfStack_27d0 = (fdb_kvs_handle *)0x10df5c;
    pfVar12 = (fdb_kvs_handle *)strlen(pcVar22);
    pfStack_27d0 = (fdb_kvs_handle *)0x10df67;
    sVar6 = strlen(pcVar26);
    pfStack_27d0 = (fdb_kvs_handle *)0x10df7b;
    fVar2 = fdb_set_kv(pfVar11,pcVar22,(size_t)pfVar12,pcVar26,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010e2e3:
      pfStack_27d0 = (fdb_kvs_handle *)0x10e2ea;
      fragmented_reuse_test();
      goto LAB_0010e2ea;
    }
    pfStack_27d0 = (fdb_kvs_handle *)0x10df92;
    fVar2 = fdb_commit(pfStack_27b8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e2e3;
      fragmented_reuse_test();
      goto LAB_0010e2e3;
    }
    uVar18 = (int)pfVar7 + 1;
    pfVar7 = (fdb_kvs_handle *)(ulong)uVar18;
  } while (uVar18 != 0xb);
  pcVar26 = (char *)&fStack_2508;
  pfVar11 = (fdb_kvs_handle *)(auStack_2750 + 0x48);
  pfVar12 = (fdb_kvs_handle *)auStack_2750;
  pcVar14 = (char *)0x0;
  do {
    uVar18 = (uint)pcVar14;
    pfStack_27d0 = (fdb_kvs_handle *)0x10dfcb;
    sprintf(pcVar26,"%dkey",pcVar14);
    pfVar7 = pfStack_27c0;
    auStack_2750._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_2700 = (docio_handle *)0x6262626262626262;
    pbStack_26f8 = (btreeblk_handle *)0x6262626262626262;
    pbStack_26f0 = (btree_blk_ops *)0x6262626262626262;
    pfStack_26e8 = (filemgr_ops *)0x6262626262626262;
    fStack_26e0.chunksize = 0x6262;
    fStack_26e0._2_2_ = 0x6262;
    fStack_26e0.blocksize = 0x62626262;
    fStack_26e0.buffercache_size = 0x6262626262626262;
    fStack_26e0.wal_threshold = 0x6262626262626262;
    fStack_26e0.wal_flush_before_commit = true;
    fStack_26e0.auto_commit = true;
    fStack_26e0._26_2_ = 0x6262;
    fStack_26e0.purging_interval = 0x62626262;
    fStack_26e0.seqtree_opt = 'b';
    fStack_26e0.durability_opt = 'b';
    fStack_26e0._34_2_ = 0x6262;
    fStack_26e0.flags = 0x62626262;
    fStack_26e0.compaction_buf_maxsize = 0x62626262;
    fStack_26e0.cleanup_cache_onclose = true;
    fStack_26e0.compress_document_body = true;
    fStack_26e0.compaction_mode = 'b';
    fStack_26e0.compaction_threshold = 'b';
    fStack_26e0.compaction_minimum_filesize = 0x6262626262626262;
    fStack_26e0.compactor_sleep_duration = 0x6262626262626262;
    fStack_26e0.multi_kv_instances = true;
    fStack_26e0._65_6_ = 0x626262626262;
    fStack_26e0._71_1_ = 0x62;
    fStack_26e0.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_26e0._79_8_ = 0x6262626262626262;
    fStack_26e0._87_1_ = 0;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e027;
    pcVar22 = (char *)strlen(pcVar26);
    pfStack_27d0 = (fdb_kvs_handle *)0x10e032;
    sVar6 = strlen((char *)pfVar11);
    pfStack_27d0 = (fdb_kvs_handle *)0x10e046;
    fVar2 = fdb_set_kv(pfVar7,pcVar26,(size_t)pcVar22,pfVar11,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f1;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e05b;
    fVar2 = fdb_get_file_info(pfStack_27b8,(fdb_file_info *)pfVar12);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ea;
    uVar23 = uVar18 + 1;
    pcVar14 = (char *)(ulong)uVar23;
  } while ((ulong)auStack_2750._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_27ac = uVar18;
  if (2 < uVar18) {
    uVar18 = (uVar23 >> 2) + (uint)(uVar23 >> 2 == 0);
    pfVar12 = (fdb_kvs_handle *)(ulong)uVar18;
    pcVar22 = "%dkey";
    pcVar26 = (char *)&fStack_2508;
    pfVar7 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e0b2;
      sprintf(pcVar26,"%dkey",pfVar7);
      pfVar11 = pfStack_27c0;
      pfStack_27d0 = (fdb_kvs_handle *)0x10e0bf;
      sVar6 = strlen(pcVar26);
      pfStack_27d0 = (fdb_kvs_handle *)0x10e0cd;
      fVar2 = fdb_del_kv(pfVar11,pcVar26,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ff;
      uVar19 = (int)pfVar7 + 1;
      pfVar7 = (fdb_kvs_handle *)(ulong)uVar19;
    } while (uVar18 != uVar19);
  }
  pcVar26 = (char *)&fStack_2508;
  pfStack_27d0 = (fdb_kvs_handle *)0x10e0e6;
  sVar3 = sb_check_block_reusing(pfStack_27c0);
  if (sVar3 == SBD_NONE) {
    pcVar26 = (char *)(pfStack_27c0->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e10c;
    fVar2 = fdb_compact(pfStack_27b8,"staleblktest_compact");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e319;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e123;
    fVar2 = fdb_get_kvs_info(pfStack_27c0,&fStack_27a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e320;
    if (fStack_27a8.doc_count == 0) {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e13d;
      fragmented_reuse_test();
    }
    pcVar22 = (char *)(ulong)(uVar23 >> 2);
    if (pcVar26 <=
        (fdb_kvs_handle *)(pfStack_27c0->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e163;
      fragmented_reuse_test();
    }
    uVar18 = uVar23 >> 1;
    pfVar7 = (fdb_kvs_handle *)(ulong)uVar18;
    if (uVar23 >> 2 < uVar18) {
      pcVar26 = "%dkey";
      pfVar11 = &fStack_2508;
      do {
        pfStack_27d0 = (fdb_kvs_handle *)0x10e18b;
        sprintf((char *)pfVar11,"%dkey",pcVar22);
        pfVar12 = pfStack_27c0;
        pfStack_27d0 = (fdb_kvs_handle *)0x10e198;
        sVar6 = strlen((char *)pfVar11);
        pfStack_27d0 = (fdb_kvs_handle *)0x10e1a6;
        fVar2 = fdb_del_kv(pfVar12,pfVar11,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e306;
        uVar19 = (int)pcVar22 + 1;
        pcVar22 = (char *)(ulong)uVar19;
      } while (uVar19 < uVar18);
    }
    pfStack_27d0 = (fdb_kvs_handle *)0x10e1c0;
    sVar3 = sb_check_block_reusing(pfStack_27c0);
    if (sVar3 != SBD_NONE) goto LAB_0010e327;
    if (uVar18 <= uStack_27ac) {
      pcVar22 = "%dkey";
      pcVar26 = (char *)&fStack_2508;
      do {
        pfStack_27d0 = (fdb_kvs_handle *)0x10e1ec;
        sprintf(pcVar26,"%dkey",pfVar7);
        pfVar11 = pfStack_27c0;
        pfStack_27d0 = (fdb_kvs_handle *)0x10e1f9;
        sVar6 = strlen(pcVar26);
        pfStack_27d0 = (fdb_kvs_handle *)0x10e207;
        fVar2 = fdb_del_kv(pfVar11,pcVar26,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e30d;
        uVar18 = (int)pfVar7 + 1;
        pfVar7 = (fdb_kvs_handle *)(ulong)uVar18;
      } while (uVar23 != uVar18);
    }
    pcVar14 = (char *)0xb;
    do {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e229;
      fVar2 = fdb_commit(pfStack_27b8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f8;
      uVar18 = (int)pcVar14 - 1;
      pcVar14 = (char *)(ulong)uVar18;
    } while (uVar18 != 0);
    pfStack_27d0 = (fdb_kvs_handle *)0x10e244;
    fVar2 = fdb_get_kvs_info(pfStack_27c0,&fStack_27a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e32c;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e256;
    sVar3 = sb_check_block_reusing(pfStack_27c0);
    if (sVar3 == SBD_NONE) goto LAB_0010e333;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e26d;
    fVar2 = fdb_commit(pfStack_27b8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e338;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e27f;
    fVar2 = fdb_close(pfStack_27b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e33f;
    pfStack_27d0 = (fdb_kvs_handle *)0x10e28c;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_27d0 = (fdb_kvs_handle *)0x10e299;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_27d0 = (fdb_kvs_handle *)0x10e2ca;
      fprintf(_stderr,pcVar22,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e314:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e319;
    fragmented_reuse_test();
LAB_0010e319:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e320;
    fragmented_reuse_test();
LAB_0010e320:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e327;
    fragmented_reuse_test();
LAB_0010e327:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e32c;
    fragmented_reuse_test();
LAB_0010e32c:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e333;
    fragmented_reuse_test();
LAB_0010e333:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e338;
    fragmented_reuse_test();
LAB_0010e338:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e33f;
    fragmented_reuse_test();
LAB_0010e33f:
    pfStack_27d0 = (fdb_kvs_handle *)0x10e346;
    fragmented_reuse_test();
  }
  pfStack_27d0 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_2c98 = (code *)0x10e36a;
  pcStack_27f8 = pcVar14;
  pfStack_27f0 = pfVar11;
  pfStack_27e8 = pfVar12;
  pfStack_27e0 = (fdb_kvs_handle *)pcVar22;
  pfStack_27d8 = (fdb_kvs_handle *)pcVar26;
  pfStack_27d0 = pfVar7;
  gettimeofday(&tStack_2c60,(__timezone_ptr_t)0x0);
  pcStackY_2c98 = (code *)0x10e36f;
  memleak_start();
  pfStack_2c70 = (fdb_doc *)0x0;
  pcStackY_2c98 = (code *)0x10e388;
  fdb_get_default_kvs_config();
  pcStackY_2c98 = (code *)0x10e398;
  fdb_get_default_config();
  fStack_28f0.compaction_threshold = '\0';
  fStack_28f0.block_reusing_threshold = 0x23;
  fStack_28f0.num_keeping_headers = 10;
  pcStackY_2c98 = (code *)0x10e3bf;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_2c98 = (code *)0x10e3d6;
  fdb_open(&pfStack_2c80,"./staleblktest1",&fStack_28f0);
  pcStackY_2c98 = (code *)0x10e3ed;
  fdb_kvs_open(pfStack_2c80,&pfStack_2c88,"db",&fStack_2a50);
  pcStackY_2c98 = (code *)0x10e404;
  fdb_kvs_open(pfStack_2c80,&pfStack_2c68,"db2",&fStack_2a50);
  pcVar22 = acStack_29f0;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar26 = acStack_2c50;
  pcVar14 = (char *)0x0;
  do {
    pcStackY_2c98 = (code *)0x10e430;
    sprintf(pcVar22,"%dkey",pcVar14);
    pfVar7 = pfStack_2c88;
    builtin_strncpy(acStack_2c50,"aaaaaaaaaaa",0xc);
    pcStackY_2c98 = (code *)0x10e44f;
    sVar9 = strlen(pcVar22);
    pcStackY_2c98 = (code *)0x10e45a;
    sVar6 = strlen(pcVar26);
    pcStackY_2c98 = (code *)0x10e46e;
    fVar2 = fdb_set_kv(pfVar7,pcVar22,sVar9,pcVar26,sVar6);
    pfVar7 = pfStack_2c68;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_2c98 = (code *)0x10e779;
      enter_reuse_via_separate_kvs_test();
LAB_0010e779:
      pcStackY_2c98 = (code *)0x10e780;
      enter_reuse_via_separate_kvs_test();
LAB_0010e780:
      pcStackY_2c98 = (code *)0x10e787;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e787;
    }
    pcStackY_2c98 = (code *)0x10e483;
    sVar9 = strlen(pcVar22);
    pcStackY_2c98 = (code *)0x10e48e;
    sVar6 = strlen(pcVar26);
    pcStackY_2c98 = (code *)0x10e4a2;
    fVar2 = fdb_set_kv(pfVar7,pcVar22,sVar9,pcVar26,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e779;
    pcStackY_2c98 = (code *)0x10e4b9;
    fVar2 = fdb_commit(pfStack_2c80,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e780;
    uVar18 = (int)pcVar14 + 1;
    pcVar14 = (char *)(ulong)uVar18;
  } while (uVar18 != 10);
  pcVar26 = (char *)0x0;
  pcVar14 = acStack_29f0;
  pcVar22 = acStack_2c50;
  doc = (fdb_doc **)0x0;
  do {
    pfVar7 = pfStack_2c88;
    builtin_strncpy(acStack_29f0,"0key",5);
    builtin_strncpy(acStack_2c50,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_2c98 = (code *)0x10e541;
    sVar9 = strlen(pcVar14);
    pcStackY_2c98 = (code *)0x10e54c;
    sVar6 = strlen(pcVar22);
    pcStackY_2c98 = (code *)0x10e560;
    fVar2 = fdb_set_kv(pfVar7,pcVar14,sVar9,pcVar22,sVar6);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78e;
    pcStackY_2c98 = (code *)0x10e57a;
    fVar2 = fdb_get_file_info(pfStack_2c80,&fStack_2a38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e787;
    uVar18 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar18;
  } while (fStack_2a38.file_size < 0x1000000);
  pcStackY_2c98 = (code *)0x10e5a0;
  sVar3 = sb_check_block_reusing(pfStack_2c88);
  if (sVar3 == SBD_RECLAIM) {
    pcStackY_2c98 = (code *)0x10e5b8;
    fVar2 = fdb_commit(pfStack_2c80,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7a6;
    pcVar22 = acStack_29f0;
    pcVar26 = acStack_2c50;
    pcVar14 = (char *)0x0;
    do {
      pcStackY_2c98 = (code *)0x10e5e2;
      sprintf(pcVar22,"key%d",pcVar14);
      pfVar7 = pfStack_2c88;
      builtin_strncpy(acStack_2c50,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_2c98 = (code *)0x10e632;
      sVar9 = strlen(pcVar22);
      pcStackY_2c98 = (code *)0x10e63d;
      sVar6 = strlen(pcVar26);
      pcStackY_2c98 = (code *)0x10e651;
      fVar2 = fdb_set_kv(pfVar7,pcVar22,sVar9,pcVar26,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e795;
      uVar23 = (int)pcVar14 + 1;
      pcVar14 = (char *)(ulong)uVar23;
    } while (uVar18 != uVar23);
    pcStackY_2c98 = (code *)0x10e672;
    fVar2 = fdb_commit(pfStack_2c80,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7ad;
    pcStackY_2c98 = (code *)0x10e69a;
    fdb_iterator_init(pfStack_2c68,&pfStack_2c78,(void *)0x0,0,(void *)0x0,0,0);
    pcVar14 = (char *)0xa;
    doc = &pfStack_2c70;
    do {
      pcStackY_2c98 = (code *)0x10e6b1;
      fVar2 = fdb_iterator_get(pfStack_2c78,doc);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e79c;
      pcStackY_2c98 = (code *)0x10e6c3;
      fdb_doc_free(pfStack_2c70);
      pfStack_2c70 = (fdb_doc *)0x0;
      pcStackY_2c98 = (code *)0x10e6d6;
      fVar2 = fdb_iterator_next(pfStack_2c78);
      uVar18 = (int)pcVar14 - 1;
      pcVar14 = (char *)(ulong)uVar18;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar18 != 0) goto LAB_0010e7b4;
    pcStackY_2c98 = (code *)0x10e6ef;
    fdb_iterator_close(pfStack_2c78);
    pcStackY_2c98 = (code *)0x10e6f9;
    fVar2 = fdb_kvs_close(pfStack_2c88);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7b9;
    pcStackY_2c98 = (code *)0x10e70b;
    fVar2 = fdb_kvs_close(pfStack_2c68);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_2c98 = (code *)0x10e71d;
      fVar2 = fdb_close(pfStack_2c80);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStackY_2c98 = (code *)0x10e72a;
        fdb_shutdown();
        pcStackY_2c98 = (code *)0x10e72f;
        memleak_end();
        pcVar22 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        pcStackY_2c98 = (code *)0x10e760;
        fprintf(_stderr,pcVar22,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7c7;
    }
  }
  else {
LAB_0010e7a1:
    pcStackY_2c98 = (code *)0x10e7a6;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7a6:
    pcStackY_2c98 = (code *)0x10e7ad;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7ad:
    pcStackY_2c98 = (code *)0x10e7b4;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b4:
    pcStackY_2c98 = (code *)0x10e7b9;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b9:
    pcStackY_2c98 = (code *)0x10e7c0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_2c98 = (code *)0x10e7c7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7c7:
  pcStackY_2c98 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_2cc0 = doc;
  sStackY_2cb0 = sVar9;
  pcStackY_2ca8 = pcVar22;
  pcStackY_2ca0 = pcVar26;
  pcStackY_2c98 = (code *)pcVar14;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_2fc0.block_reusing_threshold = 0x41;
  fStackY_2fc0.num_keeping_headers = 5;
  fdb_open(&pfStackY_30e8,"./staleblktest1",&fStackY_2fc0);
  fdb_kvs_open(pfStackY_30e8,&pfStackY_30f0,"db",&fStackY_30e0);
  iVar4 = 0;
  uVar20 = 0;
  do {
    sprintf(acStackY_30c8,"key%d",uVar20);
    sprintf(acStackY_2ec8,"seqno%d",uVar20);
    pfVar7 = pfStackY_30f0;
    sVar6 = strlen(acStackY_30c8);
    sVar9 = strlen(acStackY_2ec8);
    fdb_set_kv(pfVar7,acStackY_30c8,sVar6,acStackY_2ec8,sVar9);
    if ((int)(uVar20 / 100) * 100 + iVar4 == 0) {
      fdb_commit(pfStackY_30e8,(int)(uVar20 / 500) * 500 + iVar4 == 0);
    }
    uVar20 = (ulong)((int)uVar20 + 1);
    iVar4 = iVar4 + -1;
  } while( true );
LAB_0010bccf:
  pcStack_778 = (code *)0x10bcd6;
  verify_minimum_num_keeping_headers_param_test();
LAB_0010bcd6:
  pcVar22 = "val";
  pfVar15 = (fdb_config *)0x148599;
  pcStack_778 = (code *)0x10bcdd;
  verify_minimum_num_keeping_headers_param_test();
  goto LAB_0010bcdd;
LAB_0010bfeb:
  pcStack_950 = (code *)0x10bff2;
  verify_high_num_keeping_headers_param_test();
LAB_0010bff2:
  pcStack_950 = (code *)0x10bff9;
  verify_high_num_keeping_headers_param_test();
  goto LAB_0010bff9;
LAB_0010c39a:
  pcStack_c18 = (code *)0x10c3a1;
  snapshot_before_block_reuse_test();
LAB_0010c3a1:
  pcStack_c18 = (code *)0x10c3a8;
  snapshot_before_block_reuse_test();
LAB_0010c3a8:
  pcStack_c18 = (code *)0x10c3af;
  snapshot_before_block_reuse_test();
LAB_0010c3af:
  pcVar26 = "val";
  pfVar15 = (fdb_config *)0x148599;
  pcStack_c18 = (code *)0x10c3b6;
  snapshot_before_block_reuse_test();
  goto LAB_0010c3b6;
LAB_0010c6ae:
  pcStack_de0 = (code *)0x10c6b5;
  snapshot_after_block_reuse_test();
LAB_0010c6b5:
  pcStack_de0 = (code *)0x10c6bc;
  snapshot_after_block_reuse_test();
  goto LAB_0010c6bc;
LAB_0010ca07:
  pcStack_f98 = (code *)0x10ca0e;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca0e:
  pcStack_f98 = (code *)0x10ca15;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca15:
  pcStack_f98 = (code *)0x10ca1c;
  snapshot_inmem_before_block_reuse_test();
LAB_0010ca1c:
  pcVar22 = "val";
  pfVar15 = (fdb_config *)0x148599;
  pcStack_f98 = (code *)0x10ca23;
  snapshot_inmem_before_block_reuse_test();
  goto LAB_0010ca23;
code_r0x0010cc8c:
  keylen = keylen + 0x400;
  if (keylen == 0xfff) goto code_r0x0010cc9c;
  goto LAB_0010cc33;
code_r0x0010cc9c:
  pcStack_1280 = (code *)0x10ccab;
  fVar2 = fdb_get_file_info(pfStack_1270,&fStack_1200);
  aVar24 = aStack_1260;
  sVar21 = sStack_1268;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d08a;
  handle_00.seqtree = (btree *)&(aStack_1260.seqtree)->vsize;
  sVar8 = (size_t)((int)sStack_1268 + 8);
  if (0xffffff < fStack_1200.file_size) goto code_r0x0010ccd6;
  goto LAB_0010cc24;
LAB_0010d08a:
  pcStack_1280 = (code *)0x10d091;
  variable_value_size_test();
LAB_0010d091:
  pcStack_1280 = (code *)0x10d098;
  variable_value_size_test();
  aVar25 = handle_00;
LAB_0010d098:
  handle_00 = aVar25;
  pcStack_1280 = (code *)0x10d09f;
  variable_value_size_test();
LAB_0010d09f:
  pcStack_1280 = (code *)0x10d0a6;
  variable_value_size_test();
  sVar21 = keylen;
  aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar14;
  goto LAB_0010d0a6;
code_r0x0010ccd6:
  pcStack_1280 = (code *)0x10ccdf;
  sVar3 = sb_check_block_reusing((fdb_kvs_handle *)aStack_1278.seqtree);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010d0ad;
  pcStack_1280 = (code *)0x10ccf4;
  fVar2 = fdb_commit(pfStack_1270,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b2;
  pcStack_1280 = (code *)0x10cd11;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_1278.seqtree,
                            (fdb_kvs_handle **)&aStack_1248.seqtree,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b9;
  if ((fdb_kvs_handle *)aVar24.seqtree != (fdb_kvs_handle *)0x0) {
    aStack_1238.seqtree = aVar24.seqtree;
    pcVar22 = (char *)0x0;
    aStack_1230 = handle_00;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar24;
      uVar18 = (int)sVar21 + 1;
      pcStack_1280 = (code *)0x10cd63;
      sprintf((char *)&fStack_11b8,"%d_key",(ulong)uVar18);
      sStack_1268 = sVar21;
      aStack_1260 = aVar24;
      if ((int)uVar18 < 2) {
        uVar20 = 0;
      }
      else {
        uVar20 = sVar21 & 0xffffffff;
        pcStack_1280 = (code *)0x10cd85;
        memset(pcVar26,99,uVar20);
      }
      pcVar14 = (char *)aStack_1278;
      pcVar26[uVar20] = '\0';
      pfVar15 = &fStack_11b8;
      pcStack_1280 = (code *)0x10cda1;
      sVar6 = strlen((char *)pfVar15);
      keylen = sVar6 + 1;
      pcStack_1280 = (code *)0x10cdad;
      sVar6 = strlen(pcVar26);
      pcStack_1280 = (code *)0x10cdc2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar14,pfVar15,keylen,pcVar26,sVar6 + 1);
      handle_00 = aStack_1230;
      aVar25 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d098;
      if ((fdb_kvs_handle *)
          (&((fdb_kvs_config *)&(aStack_1230.seqtree)->ksize)->create_if_missing +
          ~(((ulong)aVar24.seqtree / 5 & 0xfffffffffffffffe) * 5)) == (fdb_kvs_handle *)pcVar22) {
        pcStack_1280 = (code *)0x10cdfc;
        fVar2 = fdb_commit(pfStack_1270,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d09f;
      }
      aVar24.seqtree = (btree *)((long)&aStack_1260.seqtree[-1].aux + 7);
      pcVar22 = (char *)&((btree *)pcVar22)->vsize;
      sVar21 = (size_t)((int)sStack_1268 - 8);
    } while (aStack_1238.seqtree != (btree *)pcVar22);
  }
  pfVar15 = &fStack_11b8;
  pcStack_1280 = (code *)0x10ce31;
  fVar2 = fdb_commit(pfStack_1270,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c0;
  aVar24.seqtree = (btree *)&fStack_11b8;
  pcStack_1280 = (code *)0x10ce57;
  sprintf((char *)aVar24.seqtree,"%d_key",0x200);
  pcStack_1280 = (code *)0x10ce69;
  memset(pcVar26,0x61,0x4fffff);
  pcVar22 = (char *)aStack_1278;
  pcVar26[0x4fffff] = '\0';
  pcStack_1280 = (code *)0x10ce7c;
  sVar6 = strlen((char *)aVar24.seqtree);
  pfVar15 = (fdb_config *)(sVar6 + 1);
  pcStack_1280 = (code *)0x10ce88;
  sVar6 = strlen(pcVar26);
  pcStack_1280 = (code *)0x10ce9d;
  fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar22,aVar24.seqtree,(size_t)pfVar15,pcVar26,sVar6 + 1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c7;
  pcStack_1280 = (code *)0x10ceb4;
  fVar2 = fdb_commit(pfStack_1270,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ce;
  pcStack_1280 = (code *)0x10ceda;
  sprintf((char *)&fStack_11b8,"%d_key",0x200);
  pcStack_1280 = (code *)0x10ceec;
  memset(pcVar26,0x61,0x1ff);
  pcVar22 = (char *)aStack_1240;
  pcVar26[0x1ff] = '\0';
  pcStack_1280 = (code *)0x10cf00;
  sVar6 = strlen((char *)&fStack_11b8);
  pcStack_1280 = (code *)0x10cf19;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar22,(btree *)&fStack_11b8,sVar6 + 1,&aStack_1250.seqtree,
                     (size_t *)&pkStack_1258);
  aVar25 = aStack_1250;
  aVar24.seqtree = (btree *)&fStack_11b8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0d5;
  pcStack_1280 = (code *)0x10cf36;
  iVar4 = bcmp(pcVar26,aStack_1250.seqtree,(size_t)pkStack_1258);
  if (iVar4 != 0) goto LAB_0010d0dc;
  pcStack_1280 = (code *)0x10cf46;
  fVar2 = fdb_free_block(aVar25.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e4;
  aVar25.seqtree = (btree *)&fStack_11b8;
  pcStack_1280 = (code *)0x10cf6c;
  sprintf((char *)aVar25.seqtree,"%d_key",0x800);
  pcStack_1280 = (code *)0x10cf7e;
  memset(pcVar26,0x62,0x7ff);
  pcVar22 = (char *)aStack_1248;
  pcVar26[0x7ff] = '\0';
  pcStack_1280 = (code *)0x10cf92;
  sVar6 = strlen((char *)aVar25.seqtree);
  pcStack_1280 = (code *)0x10cfab;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar22,aVar25.seqtree,sVar6 + 1,&aStack_1250.seqtree,
                     (size_t *)&pkStack_1258);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0eb;
  pcStack_1280 = (code *)0x10cfc8;
  iVar4 = bcmp(pcVar26,aStack_1250.seqtree,(size_t)pkStack_1258);
  aVar25 = aStack_1250;
  if (iVar4 != 0) goto LAB_0010d0f2;
  pcStack_1280 = (code *)0x10cfd8;
  fVar2 = fdb_free_block(aStack_1250.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0fa;
  pcStack_1280 = (code *)0x10cfe8;
  operator_delete__(pcVar26);
  pcStack_1280 = (code *)0x10cff1;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1278.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d101;
  pcStack_1280 = (code *)0x10d003;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1240.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d108;
  pcStack_1280 = (code *)0x10d015;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1248.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d10f;
  pcStack_1280 = (code *)0x10d027;
  fVar2 = fdb_close(pfStack_1270);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_1280 = (code *)0x10d034;
    fdb_shutdown();
    pcStack_1280 = (code *)0x10d039;
    memleak_end();
    pcVar22 = "%s PASSED\n";
    if (variable_value_size_test()::__test_pass != '\0') {
      pcVar22 = "%s FAILED\n";
    }
    pcStack_1280 = (code *)0x10d06a;
    fprintf(_stderr,pcVar22,"variable value size test");
    return;
  }
  goto LAB_0010d116;
LAB_0010d46c:
  pcStack_1958 = (code *)0x10d473;
  rollback_with_num_keeping_headers();
LAB_0010d473:
  pcStack_1958 = (code *)0x10d47a;
  rollback_with_num_keeping_headers();
LAB_0010d47a:
  pcStack_1958 = (code *)0x10d481;
  rollback_with_num_keeping_headers();
  goto LAB_0010d481;
LAB_0010da0f:
  pcStack_1e40 = (code *)0x10da16;
  crash_and_recover_with_num_keeping_test();
LAB_0010da16:
  pcStack_1e40 = (code *)0x10da1d;
  crash_and_recover_with_num_keeping_test();
LAB_0010da1d:
  pcStack_1e40 = (code *)0x10da24;
  crash_and_recover_with_num_keeping_test();
LAB_0010da24:
  pcStack_1e40 = (code *)0x10da2b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da2b:
  pcStack_1e40 = (code *)0x10da32;
  crash_and_recover_with_num_keeping_test();
LAB_0010da32:
  pcStack_1e40 = (code *)0x10da39;
  crash_and_recover_with_num_keeping_test();
LAB_0010da39:
  pcStack_1e40 = (code *)0x10da40;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da40;
LAB_0010de40:
  pfStack_22e8 = (fdb_kvs_handle *)0x10de47;
  reuse_on_delete_test();
LAB_0010de47:
  pfVar10 = pfVar11;
  pfStack_22e8 = (fdb_kvs_handle *)0x10de4e;
  reuse_on_delete_test();
LAB_0010de4e:
  pfStack_22e8 = (fdb_kvs_handle *)0x10de55;
  reuse_on_delete_test();
LAB_0010de55:
  pfStack_22e8 = (fdb_kvs_handle *)0x10de5c;
  reuse_on_delete_test();
  pfVar11 = pfVar10;
  goto LAB_0010de5c;
LAB_0010e2ea:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2f1;
  fragmented_reuse_test();
LAB_0010e2f1:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2f8;
  fragmented_reuse_test();
LAB_0010e2f8:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e2ff;
  fragmented_reuse_test();
LAB_0010e2ff:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e306;
  fragmented_reuse_test();
LAB_0010e306:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e30d;
  fragmented_reuse_test();
LAB_0010e30d:
  pfStack_27d0 = (fdb_kvs_handle *)0x10e314;
  fragmented_reuse_test();
  goto LAB_0010e314;
LAB_0010e787:
  pcStackY_2c98 = (code *)0x10e78e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e78e:
  pcStackY_2c98 = (code *)0x10e795;
  enter_reuse_via_separate_kvs_test();
LAB_0010e795:
  pcStackY_2c98 = (code *)0x10e79c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e79c:
  pcStackY_2c98 = (code *)0x10e7a1;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e7a1;
}

Assistant:

void reuse_with_snapshot_test() {
    TEST_INIT();
    memleak_start();

    int i, n, r;
    const int kv = 512;
    char keybuf[kv];
    char bodybuf[kv];
    void *rvalue;
    size_t rvalue_len;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 10;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create 2*num_keeping_headers
    n = 2 * fconfig.num_keeping_headers;
    for (i = 0; i < n; i++) {
        fillstr(keybuf, 'k', kv);
        sprintf(bodybuf, "orig_body%d", i+1);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf) + 1);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        fillstr(keybuf, 'r', kv);
        fillstr(bodybuf, 'y', kv);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // open snapshot
    status = fdb_snapshot_open(db, &snap_db, 8);
    TEST_STATUS(status);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // write until blocks are no longer being reused
    i = 0;
    do {
        sprintf(keybuf, "key%d", i);
        fillstr(bodybuf, 'z', kv);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        sb_decision = sb_check_block_reusing(db);
        i++;
    } while (sb_decision != SBD_NONE);

    // delete original keys
    n = 2 * fconfig.num_keeping_headers;
    for (i = 0; i < n; i++) {
        fillstr(keybuf, 'k', kv);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
    }

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    fillstr(keybuf, 'k', kv);
    sprintf(bodybuf, "orig_body%d", 8);

    // check key does not exist in main kv
    status = fdb_get_kv(db, keybuf, strlen(keybuf),
                        &rvalue, &rvalue_len);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // check still exists in snapshot data
    status = fdb_get_kv(snap_db, keybuf, strlen(keybuf),
                        &rvalue, &rvalue_len);
    TEST_STATUS(status);
    TEST_CMP(rvalue, bodybuf, rvalue_len);

    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("reuse with snapshot test");
}